

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersector1<8>::
     occluded_n<embree::avx512::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  byte bVar24;
  uint uVar25;
  ulong uVar26;
  long lVar28;
  uint uVar29;
  ulong uVar30;
  bool bVar31;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  ulong uVar32;
  uint uVar33;
  ulong uVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar65 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  float fVar93;
  undefined4 uVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar99;
  float t1;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  float fVar111;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  vfloat4 b0;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  vfloat4 b0_1;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  vfloat4 a0_3;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  vfloat4 a0_2;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar188;
  float fVar199;
  float fVar201;
  float fVar203;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar200;
  float fVar202;
  float fVar204;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar216;
  float fVar217;
  vfloat4 a0;
  undefined1 auVar209 [16];
  float fVar218;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  vfloat4 a0_1;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 in_ZMM17 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_32c;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  ulong local_300;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  ulong local_250;
  RTCFilterFunctionNArguments local_248;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  uint auStack_178 [4];
  undefined8 local_168;
  undefined4 local_160;
  undefined8 local_15c;
  undefined4 local_154;
  undefined4 local_150;
  uint local_14c;
  uint local_148;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [32];
  undefined8 uStack_b8;
  undefined1 local_98 [32];
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ulong auStack_58 [5];
  ulong uVar27;
  undefined1 auVar64 [32];
  undefined1 auVar66 [32];
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar227 [32];
  
  PVar4 = prim[1];
  uVar32 = (ulong)(byte)PVar4;
  fVar207 = *(float *)(prim + uVar32 * 0x19 + 0x12);
  auVar75._16_16_ =
       vsubps_avx((undefined1  [16])(ray->org).field_0,
                  *(undefined1 (*) [16])(prim + uVar32 * 0x19 + 6));
  fVar111 = fVar207 * auVar75._16_4_;
  fVar93 = fVar207 * (ray->dir).field_0.m128[0];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar32 * 4 + 6);
  auVar62 = vpmovsxbd_avx2(auVar39);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar32 * 5 + 6);
  auVar60 = vpmovsxbd_avx2(auVar52);
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar60 = vcvtdq2ps_avx(auVar60);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar32 * 6 + 6);
  auVar67 = vpmovsxbd_avx2(auVar51);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar32 * 0xb + 6);
  auVar77 = vpmovsxbd_avx2(auVar50);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  auVar71 = vpmovsxbd_avx2(auVar49);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar78 = vcvtdq2ps_avx(auVar71);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + (uint)(byte)PVar4 * 0xc + uVar32 + 6);
  auVar61 = vpmovsxbd_avx2(auVar48);
  auVar61 = vcvtdq2ps_avx(auVar61);
  uVar34 = (ulong)(uint)((int)(uVar32 * 9) * 2);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar34 + 6);
  auVar68 = vpmovsxbd_avx2(auVar47);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar34 + uVar32 + 6);
  auVar69 = vpmovsxbd_avx2(auVar46);
  auVar69 = vcvtdq2ps_avx(auVar69);
  uVar26 = (ulong)(uint)((int)(uVar32 * 5) << 2);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar26 + 6);
  auVar59 = vpmovsxbd_avx2(auVar42);
  auVar70 = vcvtdq2ps_avx(auVar59);
  auVar222._4_4_ = fVar93;
  auVar222._0_4_ = fVar93;
  auVar222._8_4_ = fVar93;
  auVar222._12_4_ = fVar93;
  auVar222._16_4_ = fVar93;
  auVar222._20_4_ = fVar93;
  auVar222._24_4_ = fVar93;
  auVar222._28_4_ = fVar93;
  auVar232._8_4_ = 1;
  auVar232._0_8_ = 0x100000001;
  auVar232._12_4_ = 1;
  auVar232._16_4_ = 1;
  auVar232._20_4_ = 1;
  auVar232._24_4_ = 1;
  auVar232._28_4_ = 1;
  auVar57 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar73 = ZEXT1632(CONCAT412(fVar207 * (ray->dir).field_0.m128[3],
                               CONCAT48(fVar207 * (ray->dir).field_0.m128[2],
                                        CONCAT44(fVar207 * (ray->dir).field_0.m128[1],fVar93))));
  auVar72 = vpermps_avx2(auVar232,auVar73);
  auVar58 = vpermps_avx512vl(auVar57,auVar73);
  fVar93 = auVar58._0_4_;
  fVar200 = auVar58._4_4_;
  auVar73._4_4_ = fVar200 * auVar67._4_4_;
  auVar73._0_4_ = fVar93 * auVar67._0_4_;
  fVar202 = auVar58._8_4_;
  auVar73._8_4_ = fVar202 * auVar67._8_4_;
  fVar204 = auVar58._12_4_;
  auVar73._12_4_ = fVar204 * auVar67._12_4_;
  fVar205 = auVar58._16_4_;
  auVar73._16_4_ = fVar205 * auVar67._16_4_;
  fVar206 = auVar58._20_4_;
  auVar73._20_4_ = fVar206 * auVar67._20_4_;
  fVar99 = auVar58._24_4_;
  auVar73._24_4_ = fVar99 * auVar67._24_4_;
  auVar73._28_4_ = auVar71._28_4_;
  auVar71._4_4_ = auVar61._4_4_ * fVar200;
  auVar71._0_4_ = auVar61._0_4_ * fVar93;
  auVar71._8_4_ = auVar61._8_4_ * fVar202;
  auVar71._12_4_ = auVar61._12_4_ * fVar204;
  auVar71._16_4_ = auVar61._16_4_ * fVar205;
  auVar71._20_4_ = auVar61._20_4_ * fVar206;
  auVar71._24_4_ = auVar61._24_4_ * fVar99;
  auVar71._28_4_ = auVar59._28_4_;
  auVar59._4_4_ = auVar70._4_4_ * fVar200;
  auVar59._0_4_ = auVar70._0_4_ * fVar93;
  auVar59._8_4_ = auVar70._8_4_ * fVar202;
  auVar59._12_4_ = auVar70._12_4_ * fVar204;
  auVar59._16_4_ = auVar70._16_4_ * fVar205;
  auVar59._20_4_ = auVar70._20_4_ * fVar206;
  auVar59._24_4_ = auVar70._24_4_ * fVar99;
  auVar59._28_4_ = auVar58._28_4_;
  auVar39 = vfmadd231ps_fma(auVar73,auVar72,auVar60);
  auVar52 = vfmadd231ps_fma(auVar71,auVar72,auVar78);
  auVar51 = vfmadd231ps_fma(auVar59,auVar69,auVar72);
  auVar39 = vfmadd231ps_fma(ZEXT1632(auVar39),auVar222,auVar62);
  auVar52 = vfmadd231ps_fma(ZEXT1632(auVar52),auVar222,auVar77);
  auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),auVar68,auVar222);
  auVar223._4_4_ = fVar111;
  auVar223._0_4_ = fVar111;
  auVar223._8_4_ = fVar111;
  auVar223._12_4_ = fVar111;
  auVar223._16_4_ = fVar111;
  auVar223._20_4_ = fVar111;
  auVar223._24_4_ = fVar111;
  auVar223._28_4_ = fVar111;
  auVar59 = ZEXT1632(CONCAT412(fVar207 * auVar75._28_4_,
                               CONCAT48(fVar207 * auVar75._24_4_,
                                        CONCAT44(fVar207 * auVar75._20_4_,fVar111))));
  auVar71 = vpermps_avx2(auVar232,auVar59);
  auVar59 = vpermps_avx512vl(auVar57,auVar59);
  fVar207 = auVar59._0_4_;
  fVar93 = auVar59._4_4_;
  auVar72._4_4_ = fVar93 * auVar67._4_4_;
  auVar72._0_4_ = fVar207 * auVar67._0_4_;
  fVar200 = auVar59._8_4_;
  auVar72._8_4_ = fVar200 * auVar67._8_4_;
  fVar202 = auVar59._12_4_;
  auVar72._12_4_ = fVar202 * auVar67._12_4_;
  fVar204 = auVar59._16_4_;
  auVar72._16_4_ = fVar204 * auVar67._16_4_;
  fVar205 = auVar59._20_4_;
  auVar72._20_4_ = fVar205 * auVar67._20_4_;
  fVar206 = auVar59._24_4_;
  auVar72._24_4_ = fVar206 * auVar67._24_4_;
  auVar72._28_4_ = 1;
  auVar57._4_4_ = auVar61._4_4_ * fVar93;
  auVar57._0_4_ = auVar61._0_4_ * fVar207;
  auVar57._8_4_ = auVar61._8_4_ * fVar200;
  auVar57._12_4_ = auVar61._12_4_ * fVar202;
  auVar57._16_4_ = auVar61._16_4_ * fVar204;
  auVar57._20_4_ = auVar61._20_4_ * fVar205;
  auVar57._24_4_ = auVar61._24_4_ * fVar206;
  auVar57._28_4_ = auVar67._28_4_;
  auVar61._4_4_ = auVar70._4_4_ * fVar93;
  auVar61._0_4_ = auVar70._0_4_ * fVar207;
  auVar61._8_4_ = auVar70._8_4_ * fVar200;
  auVar61._12_4_ = auVar70._12_4_ * fVar202;
  auVar61._16_4_ = auVar70._16_4_ * fVar204;
  auVar61._20_4_ = auVar70._20_4_ * fVar205;
  auVar61._24_4_ = auVar70._24_4_ * fVar206;
  auVar61._28_4_ = auVar59._28_4_;
  auVar50 = vfmadd231ps_fma(auVar72,auVar71,auVar60);
  auVar49 = vfmadd231ps_fma(auVar57,auVar71,auVar78);
  auVar48 = vfmadd231ps_fma(auVar61,auVar71,auVar69);
  auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar223,auVar62);
  auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar223,auVar77);
  auVar81._8_4_ = 0x7fffffff;
  auVar81._0_8_ = 0x7fffffff7fffffff;
  auVar81._12_4_ = 0x7fffffff;
  auVar81._16_4_ = 0x7fffffff;
  auVar81._20_4_ = 0x7fffffff;
  auVar81._24_4_ = 0x7fffffff;
  auVar81._28_4_ = 0x7fffffff;
  auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar223,auVar68);
  auVar62 = vandps_avx(ZEXT1632(auVar39),auVar81);
  auVar140._8_4_ = 0x219392ef;
  auVar140._0_8_ = 0x219392ef219392ef;
  auVar140._12_4_ = 0x219392ef;
  auVar140._16_4_ = 0x219392ef;
  auVar140._20_4_ = 0x219392ef;
  auVar140._24_4_ = 0x219392ef;
  auVar140._28_4_ = 0x219392ef;
  uVar34 = vcmpps_avx512vl(auVar62,auVar140,1);
  bVar31 = (bool)((byte)uVar34 & 1);
  auVar58._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar39._0_4_;
  bVar31 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar58._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar39._4_4_;
  bVar31 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar58._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar39._8_4_;
  bVar31 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar58._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar39._12_4_;
  auVar58._16_4_ = (uint)((byte)(uVar34 >> 4) & 1) * 0x219392ef;
  auVar58._20_4_ = (uint)((byte)(uVar34 >> 5) & 1) * 0x219392ef;
  auVar58._24_4_ = (uint)((byte)(uVar34 >> 6) & 1) * 0x219392ef;
  auVar58._28_4_ = (uint)(byte)(uVar34 >> 7) * 0x219392ef;
  auVar62 = vandps_avx(ZEXT1632(auVar52),auVar81);
  uVar34 = vcmpps_avx512vl(auVar62,auVar140,1);
  bVar31 = (bool)((byte)uVar34 & 1);
  auVar74._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar52._0_4_;
  bVar31 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar52._4_4_;
  bVar31 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar52._8_4_;
  bVar31 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar52._12_4_;
  auVar74._16_4_ = (uint)((byte)(uVar34 >> 4) & 1) * 0x219392ef;
  auVar74._20_4_ = (uint)((byte)(uVar34 >> 5) & 1) * 0x219392ef;
  auVar74._24_4_ = (uint)((byte)(uVar34 >> 6) & 1) * 0x219392ef;
  auVar74._28_4_ = (uint)(byte)(uVar34 >> 7) * 0x219392ef;
  auVar62 = vandps_avx(ZEXT1632(auVar51),auVar81);
  uVar34 = vcmpps_avx512vl(auVar62,auVar140,1);
  bVar31 = (bool)((byte)uVar34 & 1);
  auVar62._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar51._0_4_;
  bVar31 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar62._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar51._4_4_;
  bVar31 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar62._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar51._8_4_;
  bVar31 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar62._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar51._12_4_;
  auVar62._16_4_ = (uint)((byte)(uVar34 >> 4) & 1) * 0x219392ef;
  auVar62._20_4_ = (uint)((byte)(uVar34 >> 5) & 1) * 0x219392ef;
  auVar62._24_4_ = (uint)((byte)(uVar34 >> 6) & 1) * 0x219392ef;
  auVar62._28_4_ = (uint)(byte)(uVar34 >> 7) * 0x219392ef;
  auVar60 = vrcp14ps_avx512vl(auVar58);
  auVar127._8_4_ = 0x3f800000;
  auVar127._0_8_ = 0x3f8000003f800000;
  auVar127._12_4_ = 0x3f800000;
  auVar127._16_4_ = 0x3f800000;
  auVar127._20_4_ = 0x3f800000;
  auVar127._24_4_ = 0x3f800000;
  auVar127._28_4_ = 0x3f800000;
  auVar39 = vfnmadd213ps_fma(auVar58,auVar60,auVar127);
  auVar39 = vfmadd132ps_fma(ZEXT1632(auVar39),auVar60,auVar60);
  auVar60 = vrcp14ps_avx512vl(auVar74);
  auVar52 = vfnmadd213ps_fma(auVar74,auVar60,auVar127);
  auVar52 = vfmadd132ps_fma(ZEXT1632(auVar52),auVar60,auVar60);
  auVar60 = vrcp14ps_avx512vl(auVar62);
  auVar51 = vfnmadd213ps_fma(auVar62,auVar60,auVar127);
  auVar51 = vfmadd132ps_fma(ZEXT1632(auVar51),auVar60,auVar60);
  auVar62 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar32 * 7 + 6));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar62 = vsubps_avx(auVar62,ZEXT1632(auVar50));
  auVar68._4_4_ = auVar39._4_4_ * auVar62._4_4_;
  auVar68._0_4_ = auVar39._0_4_ * auVar62._0_4_;
  auVar68._8_4_ = auVar39._8_4_ * auVar62._8_4_;
  auVar68._12_4_ = auVar39._12_4_ * auVar62._12_4_;
  auVar68._16_4_ = auVar62._16_4_ * 0.0;
  auVar68._20_4_ = auVar62._20_4_ * 0.0;
  auVar68._24_4_ = auVar62._24_4_ * 0.0;
  auVar68._28_4_ = auVar62._28_4_;
  auVar62 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar32 * 9 + 6));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar62 = vsubps_avx(auVar62,ZEXT1632(auVar50));
  auVar61 = vpbroadcastd_avx512vl();
  auVar60 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar4 * 0x10 + 6));
  auVar80._0_4_ = auVar39._0_4_ * auVar62._0_4_;
  auVar80._4_4_ = auVar39._4_4_ * auVar62._4_4_;
  auVar80._8_4_ = auVar39._8_4_ * auVar62._8_4_;
  auVar80._12_4_ = auVar39._12_4_ * auVar62._12_4_;
  auVar80._16_4_ = auVar62._16_4_ * 0.0;
  auVar80._20_4_ = auVar62._20_4_ * 0.0;
  auVar80._24_4_ = auVar62._24_4_ * 0.0;
  auVar80._28_4_ = 0;
  auVar62 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar4 * 0x10 + uVar32 * -2 + 6));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar62 = vsubps_avx(auVar62,ZEXT1632(auVar49));
  auVar69._4_4_ = auVar52._4_4_ * auVar62._4_4_;
  auVar69._0_4_ = auVar52._0_4_ * auVar62._0_4_;
  auVar69._8_4_ = auVar52._8_4_ * auVar62._8_4_;
  auVar69._12_4_ = auVar52._12_4_ * auVar62._12_4_;
  auVar69._16_4_ = auVar62._16_4_ * 0.0;
  auVar69._20_4_ = auVar62._20_4_ * 0.0;
  auVar69._24_4_ = auVar62._24_4_ * 0.0;
  auVar69._28_4_ = auVar62._28_4_;
  auVar62 = vcvtdq2ps_avx(auVar60);
  auVar62 = vsubps_avx(auVar62,ZEXT1632(auVar49));
  auVar79._0_4_ = auVar52._0_4_ * auVar62._0_4_;
  auVar79._4_4_ = auVar52._4_4_ * auVar62._4_4_;
  auVar79._8_4_ = auVar52._8_4_ * auVar62._8_4_;
  auVar79._12_4_ = auVar52._12_4_ * auVar62._12_4_;
  auVar79._16_4_ = auVar62._16_4_ * 0.0;
  auVar79._20_4_ = auVar62._20_4_ * 0.0;
  auVar79._24_4_ = auVar62._24_4_ * 0.0;
  auVar79._28_4_ = 0;
  auVar62 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 + uVar32 + 6));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar62 = vsubps_avx(auVar62,ZEXT1632(auVar48));
  auVar70._4_4_ = auVar62._4_4_ * auVar51._4_4_;
  auVar70._0_4_ = auVar62._0_4_ * auVar51._0_4_;
  auVar70._8_4_ = auVar62._8_4_ * auVar51._8_4_;
  auVar70._12_4_ = auVar62._12_4_ * auVar51._12_4_;
  auVar70._16_4_ = auVar62._16_4_ * 0.0;
  auVar70._20_4_ = auVar62._20_4_ * 0.0;
  auVar70._24_4_ = auVar62._24_4_ * 0.0;
  auVar70._28_4_ = auVar62._28_4_;
  auVar62 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar32 * 0x17 + 6));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar62 = vsubps_avx(auVar62,ZEXT1632(auVar48));
  auVar76._0_4_ = auVar51._0_4_ * auVar62._0_4_;
  auVar76._4_4_ = auVar51._4_4_ * auVar62._4_4_;
  auVar76._8_4_ = auVar51._8_4_ * auVar62._8_4_;
  auVar76._12_4_ = auVar51._12_4_ * auVar62._12_4_;
  auVar76._16_4_ = auVar62._16_4_ * 0.0;
  auVar76._20_4_ = auVar62._20_4_ * 0.0;
  auVar76._24_4_ = auVar62._24_4_ * 0.0;
  auVar76._28_4_ = 0;
  auVar62 = vpminsd_avx2(auVar68,auVar80);
  auVar60 = vpminsd_avx2(auVar69,auVar79);
  auVar62 = vmaxps_avx(auVar62,auVar60);
  auVar60 = vpminsd_avx2(auVar70,auVar76);
  uVar94 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar67._4_4_ = uVar94;
  auVar67._0_4_ = uVar94;
  auVar67._8_4_ = uVar94;
  auVar67._12_4_ = uVar94;
  auVar67._16_4_ = uVar94;
  auVar67._20_4_ = uVar94;
  auVar67._24_4_ = uVar94;
  auVar67._28_4_ = uVar94;
  auVar60 = vmaxps_avx512vl(auVar60,auVar67);
  auVar62 = vmaxps_avx(auVar62,auVar60);
  auVar60._8_4_ = 0x3f7ffffa;
  auVar60._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar60._12_4_ = 0x3f7ffffa;
  auVar60._16_4_ = 0x3f7ffffa;
  auVar60._20_4_ = 0x3f7ffffa;
  auVar60._24_4_ = 0x3f7ffffa;
  auVar60._28_4_ = 0x3f7ffffa;
  local_98 = vmulps_avx512vl(auVar62,auVar60);
  auVar62 = vpmaxsd_avx2(auVar68,auVar80);
  auVar60 = vpmaxsd_avx2(auVar69,auVar79);
  auVar62 = vminps_avx(auVar62,auVar60);
  auVar60 = vpmaxsd_avx2(auVar70,auVar76);
  fVar207 = ray->tfar;
  auVar77._4_4_ = fVar207;
  auVar77._0_4_ = fVar207;
  auVar77._8_4_ = fVar207;
  auVar77._12_4_ = fVar207;
  auVar77._16_4_ = fVar207;
  auVar77._20_4_ = fVar207;
  auVar77._24_4_ = fVar207;
  auVar77._28_4_ = fVar207;
  auVar60 = vminps_avx512vl(auVar60,auVar77);
  auVar62 = vminps_avx(auVar62,auVar60);
  auVar78._8_4_ = 0x3f800003;
  auVar78._0_8_ = 0x3f8000033f800003;
  auVar78._12_4_ = 0x3f800003;
  auVar78._16_4_ = 0x3f800003;
  auVar78._20_4_ = 0x3f800003;
  auVar78._24_4_ = 0x3f800003;
  auVar78._28_4_ = 0x3f800003;
  auVar62 = vmulps_avx512vl(auVar62,auVar78);
  uVar10 = vpcmpgtd_avx512vl(auVar61,_DAT_01fe9900);
  uVar9 = vcmpps_avx512vl(local_98,auVar62,2);
  if ((byte)((byte)uVar9 & (byte)uVar10) == 0) {
    return false;
  }
  uVar34 = (ulong)(byte)((byte)uVar9 & (byte)uVar10);
  auVar75._16_16_ = auVar62._16_16_;
  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar243 = ZEXT1664(auVar39);
  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar233 = ZEXT1664(auVar39);
  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar234 = ZEXT1664(auVar39);
  auVar242 = ZEXT464(0x3f800000);
LAB_01d3163a:
  lVar28 = 0;
  for (uVar26 = uVar34; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
    lVar28 = lVar28 + 1;
  }
  local_300 = (ulong)*(uint *)(prim + 2);
  local_250 = (ulong)*(uint *)(prim + lVar28 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[local_300].ptr;
  uVar26 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_250);
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar39 = *(undefined1 (*) [16])(_Var8 + uVar26 * (long)pvVar7);
  auVar52 = *(undefined1 (*) [16])(_Var8 + (uVar26 + 1) * (long)pvVar7);
  auVar51 = *(undefined1 (*) [16])(_Var8 + (uVar26 + 2) * (long)pvVar7);
  auVar50 = *(undefined1 (*) [16])(_Var8 + (long)pvVar7 * (uVar26 + 3));
  lVar28 = *(long *)&pGVar5[1].time_range.upper;
  auVar49 = *(undefined1 (*) [16])(lVar28 + (long)p_Var6 * uVar26);
  auVar48 = *(undefined1 (*) [16])(lVar28 + (long)p_Var6 * (uVar26 + 1));
  auVar47 = *(undefined1 (*) [16])(lVar28 + (long)p_Var6 * (uVar26 + 2));
  uVar34 = uVar34 - 1 & uVar34;
  auVar46 = *(undefined1 (*) [16])(lVar28 + (long)p_Var6 * (uVar26 + 3));
  if (uVar34 != 0) {
    uVar32 = uVar34 - 1 & uVar34;
    for (uVar26 = uVar34; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
    }
    if (uVar32 != 0) {
      for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar105 = auVar243._0_16_;
  auVar40 = vmulps_avx512vl(auVar46,auVar105);
  auVar42 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar47,auVar40);
  auVar41._0_4_ = auVar48._0_4_ + auVar42._0_4_;
  auVar41._4_4_ = auVar48._4_4_ + auVar42._4_4_;
  auVar41._8_4_ = auVar48._8_4_ + auVar42._8_4_;
  auVar41._12_4_ = auVar48._12_4_ + auVar42._12_4_;
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar49,auVar105);
  auVar64._0_16_ = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar42 = vmulps_avx512vl(auVar46,auVar64._0_16_);
  auVar100 = auVar233._0_16_;
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar47,auVar100);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar48,auVar64._0_16_);
  auVar43 = vfnmadd231ps_avx512vl(auVar42,auVar49,auVar100);
  auVar44 = vmulps_avx512vl(auVar50,auVar105);
  auVar42 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar51,auVar44);
  auVar209._0_4_ = auVar42._0_4_ + auVar52._0_4_;
  auVar209._4_4_ = auVar42._4_4_ + auVar52._4_4_;
  auVar209._8_4_ = auVar42._8_4_ + auVar52._8_4_;
  auVar209._12_4_ = auVar42._12_4_ + auVar52._12_4_;
  auVar42 = vfmadd231ps_avx512vl(auVar209,auVar39,auVar105);
  auVar45 = vmulps_avx512vl(auVar50,auVar64._0_16_);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar51,auVar100);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar52,auVar64._0_16_);
  auVar45 = vfnmadd231ps_avx512vl(auVar45,auVar39,auVar100);
  auVar55._0_4_ = auVar47._0_4_ + auVar40._0_4_;
  auVar55._4_4_ = auVar47._4_4_ + auVar40._4_4_;
  auVar55._8_4_ = auVar47._8_4_ + auVar40._8_4_;
  auVar55._12_4_ = auVar47._12_4_ + auVar40._12_4_;
  auVar40 = vfmadd231ps_avx512vl(auVar55,auVar48,auVar64._0_16_);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar49,auVar105);
  auVar46 = vmulps_avx512vl(auVar46,auVar100);
  auVar47 = vfmadd231ps_avx512vl(auVar46,auVar64._0_16_,auVar47);
  auVar48 = vfnmadd231ps_avx512vl(auVar47,auVar100,auVar48);
  auVar47 = vfmadd231ps_avx512vl(auVar48,auVar64._0_16_,auVar49);
  auVar160._0_4_ = auVar44._0_4_ + auVar51._0_4_;
  auVar160._4_4_ = auVar44._4_4_ + auVar51._4_4_;
  auVar160._8_4_ = auVar44._8_4_ + auVar51._8_4_;
  auVar160._12_4_ = auVar44._12_4_ + auVar51._12_4_;
  auVar49 = vfmadd231ps_avx512vl(auVar160,auVar52,auVar64._0_16_);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar39,auVar105);
  auVar50 = vmulps_avx512vl(auVar50,auVar100);
  auVar51 = vfmadd231ps_avx512vl(auVar50,auVar64._0_16_,auVar51);
  auVar52 = vfnmadd231ps_avx512vl(auVar51,auVar100,auVar52);
  auVar48 = vfmadd231ps_avx512vl(auVar52,auVar64._0_16_,auVar39);
  auVar39 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar52 = vshufps_avx(auVar42,auVar42,0xc9);
  fVar204 = auVar43._0_4_;
  auVar129._0_4_ = fVar204 * auVar52._0_4_;
  fVar205 = auVar43._4_4_;
  auVar129._4_4_ = fVar205 * auVar52._4_4_;
  fVar206 = auVar43._8_4_;
  auVar129._8_4_ = fVar206 * auVar52._8_4_;
  fVar99 = auVar43._12_4_;
  auVar129._12_4_ = fVar99 * auVar52._12_4_;
  auVar52 = vfmsub231ps_fma(auVar129,auVar39,auVar42);
  auVar51 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar52 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar130._0_4_ = fVar204 * auVar52._0_4_;
  auVar130._4_4_ = fVar205 * auVar52._4_4_;
  auVar130._8_4_ = fVar206 * auVar52._8_4_;
  auVar130._12_4_ = fVar99 * auVar52._12_4_;
  auVar39 = vfmsub231ps_fma(auVar130,auVar39,auVar45);
  auVar50 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar39 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar52 = vshufps_avx(auVar49,auVar49,0xc9);
  fVar111 = auVar47._0_4_;
  auVar121._0_4_ = fVar111 * auVar52._0_4_;
  fVar118 = auVar47._4_4_;
  auVar121._4_4_ = fVar118 * auVar52._4_4_;
  fVar119 = auVar47._8_4_;
  auVar121._8_4_ = fVar119 * auVar52._8_4_;
  fVar120 = auVar47._12_4_;
  auVar121._12_4_ = fVar120 * auVar52._12_4_;
  auVar52 = vfmsub231ps_fma(auVar121,auVar39,auVar49);
  auVar49 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar52 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar161._0_4_ = auVar52._0_4_ * fVar111;
  auVar161._4_4_ = auVar52._4_4_ * fVar118;
  auVar161._8_4_ = auVar52._8_4_ * fVar119;
  auVar161._12_4_ = auVar52._12_4_ * fVar120;
  auVar39 = vfmsub231ps_fma(auVar161,auVar39,auVar48);
  auVar48 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar39 = vdpps_avx(auVar51,auVar51,0x7f);
  fVar93 = auVar39._0_4_;
  auVar64._16_16_ = auVar75._16_16_;
  auVar63._4_28_ = auVar64._4_28_;
  auVar63._0_4_ = fVar93;
  auVar52 = vrsqrt14ss_avx512f(auVar64._0_16_,auVar63._0_16_);
  fVar207 = auVar52._0_4_;
  fVar207 = fVar207 * 1.5 + fVar93 * -0.5 * fVar207 * fVar207 * fVar207;
  auVar52 = vdpps_avx(auVar51,auVar50,0x7f);
  fVar208 = fVar207 * auVar51._0_4_;
  fVar216 = fVar207 * auVar51._4_4_;
  fVar217 = fVar207 * auVar51._8_4_;
  fVar218 = fVar207 * auVar51._12_4_;
  auVar169._0_4_ = auVar50._0_4_ * fVar93;
  auVar169._4_4_ = auVar50._4_4_ * fVar93;
  auVar169._8_4_ = auVar50._8_4_ * fVar93;
  auVar169._12_4_ = auVar50._12_4_ * fVar93;
  fVar93 = auVar52._0_4_;
  auVar143._0_4_ = fVar93 * auVar51._0_4_;
  auVar143._4_4_ = fVar93 * auVar51._4_4_;
  auVar143._8_4_ = fVar93 * auVar51._8_4_;
  auVar143._12_4_ = fVar93 * auVar51._12_4_;
  auVar51 = vsubps_avx(auVar169,auVar143);
  auVar52 = vrcp14ss_avx512f(auVar64._0_16_,auVar63._0_16_);
  auVar39 = vfnmadd213ss_avx512f(auVar39,auVar52,ZEXT416(0x40000000));
  fVar200 = auVar52._0_4_ * auVar39._0_4_;
  auVar39 = vdpps_avx(auVar49,auVar49,0x7f);
  fVar202 = auVar39._0_4_;
  auVar66._16_16_ = auVar75._16_16_;
  auVar66._0_16_ = auVar64._0_16_;
  auVar65._4_28_ = auVar66._4_28_;
  auVar65._0_4_ = fVar202;
  auVar52 = vrsqrt14ss_avx512f(auVar64._0_16_,auVar65._0_16_);
  fVar93 = auVar52._0_4_;
  fVar93 = fVar93 * 1.5 + fVar202 * -0.5 * fVar93 * fVar93 * fVar93;
  auVar52 = vdpps_avx(auVar49,auVar48,0x7f);
  fVar188 = fVar93 * auVar49._0_4_;
  fVar199 = fVar93 * auVar49._4_4_;
  fVar201 = fVar93 * auVar49._8_4_;
  fVar203 = fVar93 * auVar49._12_4_;
  auVar131._0_4_ = fVar202 * auVar48._0_4_;
  auVar131._4_4_ = fVar202 * auVar48._4_4_;
  auVar131._8_4_ = fVar202 * auVar48._8_4_;
  auVar131._12_4_ = fVar202 * auVar48._12_4_;
  fVar202 = auVar52._0_4_;
  auVar122._0_4_ = fVar202 * auVar49._0_4_;
  auVar122._4_4_ = fVar202 * auVar49._4_4_;
  auVar122._8_4_ = fVar202 * auVar49._8_4_;
  auVar122._12_4_ = fVar202 * auVar49._12_4_;
  auVar50 = vsubps_avx(auVar131,auVar122);
  auVar52 = vrcp14ss_avx512f(auVar64._0_16_,auVar65._0_16_);
  auVar39 = vfnmadd213ss_avx512f(auVar39,auVar52,ZEXT416(0x40000000));
  fVar202 = auVar52._0_4_ * auVar39._0_4_;
  auVar39 = vshufps_avx(auVar41,auVar41,0xff);
  auVar150._0_4_ = fVar208 * auVar39._0_4_;
  auVar150._4_4_ = fVar216 * auVar39._4_4_;
  auVar150._8_4_ = fVar217 * auVar39._8_4_;
  auVar150._12_4_ = fVar218 * auVar39._12_4_;
  local_1a8 = vsubps_avx(auVar41,auVar150);
  auVar52 = vshufps_avx(auVar43,auVar43,0xff);
  auVar132._0_4_ = auVar52._0_4_ * fVar208 + auVar39._0_4_ * fVar207 * auVar51._0_4_ * fVar200;
  auVar132._4_4_ = auVar52._4_4_ * fVar216 + auVar39._4_4_ * fVar207 * auVar51._4_4_ * fVar200;
  auVar132._8_4_ = auVar52._8_4_ * fVar217 + auVar39._8_4_ * fVar207 * auVar51._8_4_ * fVar200;
  auVar132._12_4_ = auVar52._12_4_ * fVar218 + auVar39._12_4_ * fVar207 * auVar51._12_4_ * fVar200;
  auVar51 = vsubps_avx(auVar43,auVar132);
  local_1b8._0_4_ = auVar41._0_4_ + auVar150._0_4_;
  local_1b8._4_4_ = auVar41._4_4_ + auVar150._4_4_;
  fStack_1b0 = auVar41._8_4_ + auVar150._8_4_;
  fStack_1ac = auVar41._12_4_ + auVar150._12_4_;
  auVar39 = vshufps_avx(auVar40,auVar40,0xff);
  auVar133._0_4_ = fVar188 * auVar39._0_4_;
  auVar133._4_4_ = fVar199 * auVar39._4_4_;
  auVar133._8_4_ = fVar201 * auVar39._8_4_;
  auVar133._12_4_ = fVar203 * auVar39._12_4_;
  local_1c8 = vsubps_avx(auVar40,auVar133);
  auVar52 = vshufps_avx(auVar47,auVar47,0xff);
  auVar100._0_4_ = fVar188 * auVar52._0_4_ + auVar39._0_4_ * fVar93 * auVar50._0_4_ * fVar202;
  auVar100._4_4_ = fVar199 * auVar52._4_4_ + auVar39._4_4_ * fVar93 * auVar50._4_4_ * fVar202;
  auVar100._8_4_ = fVar201 * auVar52._8_4_ + auVar39._8_4_ * fVar93 * auVar50._8_4_ * fVar202;
  auVar100._12_4_ = fVar203 * auVar52._12_4_ + auVar39._12_4_ * fVar93 * auVar50._12_4_ * fVar202;
  auVar39 = vsubps_avx(auVar47,auVar100);
  _local_1d8 = vaddps_avx512vl(auVar40,auVar133);
  auVar56._0_4_ = auVar51._0_4_ * 0.33333334;
  auVar56._4_4_ = auVar51._4_4_ * 0.33333334;
  auVar56._8_4_ = auVar51._8_4_ * 0.33333334;
  auVar56._12_4_ = auVar51._12_4_ * 0.33333334;
  local_1e8 = vaddps_avx512vl(local_1a8,auVar56);
  auVar102._0_4_ = auVar39._0_4_ * 0.33333334;
  auVar102._4_4_ = auVar39._4_4_ * 0.33333334;
  auVar102._8_4_ = auVar39._8_4_ * 0.33333334;
  auVar102._12_4_ = auVar39._12_4_ * 0.33333334;
  local_1f8 = vsubps_avx512vl(local_1c8,auVar102);
  auVar43._0_4_ = (fVar204 + auVar132._0_4_) * 0.33333334;
  auVar43._4_4_ = (fVar205 + auVar132._4_4_) * 0.33333334;
  auVar43._8_4_ = (fVar206 + auVar132._8_4_) * 0.33333334;
  auVar43._12_4_ = (fVar99 + auVar132._12_4_) * 0.33333334;
  _local_208 = vaddps_avx512vl(_local_1b8,auVar43);
  auVar44._0_4_ = (fVar111 + auVar100._0_4_) * 0.33333334;
  auVar44._4_4_ = (fVar118 + auVar100._4_4_) * 0.33333334;
  auVar44._8_4_ = (fVar119 + auVar100._8_4_) * 0.33333334;
  auVar44._12_4_ = (fVar120 + auVar100._12_4_) * 0.33333334;
  _local_218 = vsubps_avx512vl(_local_1d8,auVar44);
  aVar1 = (ray->org).field_0;
  auVar52 = vsubps_avx(local_1a8,(undefined1  [16])aVar1);
  uVar94 = auVar52._0_4_;
  auVar53._4_4_ = uVar94;
  auVar53._0_4_ = uVar94;
  auVar53._8_4_ = uVar94;
  auVar53._12_4_ = uVar94;
  auVar39 = vshufps_avx(auVar52,auVar52,0x55);
  auVar52 = vshufps_avx(auVar52,auVar52,0xaa);
  aVar2 = (pre->ray_space).vx.field_0;
  aVar3 = (pre->ray_space).vy.field_0;
  fVar207 = (pre->ray_space).vz.field_0.m128[0];
  fVar93 = (pre->ray_space).vz.field_0.m128[1];
  fVar200 = (pre->ray_space).vz.field_0.m128[2];
  fVar202 = (pre->ray_space).vz.field_0.m128[3];
  auVar45._0_4_ = fVar207 * auVar52._0_4_;
  auVar45._4_4_ = fVar93 * auVar52._4_4_;
  auVar45._8_4_ = fVar200 * auVar52._8_4_;
  auVar45._12_4_ = fVar202 * auVar52._12_4_;
  auVar39 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar3,auVar39);
  auVar49 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar2,auVar53);
  auVar52 = vsubps_avx512vl(local_1e8,(undefined1  [16])aVar1);
  uVar94 = auVar52._0_4_;
  auVar103._4_4_ = uVar94;
  auVar103._0_4_ = uVar94;
  auVar103._8_4_ = uVar94;
  auVar103._12_4_ = uVar94;
  auVar39 = vshufps_avx(auVar52,auVar52,0x55);
  auVar52 = vshufps_avx(auVar52,auVar52,0xaa);
  auVar54._0_4_ = fVar207 * auVar52._0_4_;
  auVar54._4_4_ = fVar93 * auVar52._4_4_;
  auVar54._8_4_ = fVar200 * auVar52._8_4_;
  auVar54._12_4_ = fVar202 * auVar52._12_4_;
  auVar39 = vfmadd231ps_fma(auVar54,(undefined1  [16])aVar3,auVar39);
  auVar48 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar2,auVar103);
  auVar52 = vsubps_avx512vl(local_1f8,(undefined1  [16])aVar1);
  uVar94 = auVar52._0_4_;
  auVar151._4_4_ = uVar94;
  auVar151._0_4_ = uVar94;
  auVar151._8_4_ = uVar94;
  auVar151._12_4_ = uVar94;
  auVar39 = vshufps_avx(auVar52,auVar52,0x55);
  auVar52 = vshufps_avx(auVar52,auVar52,0xaa);
  auVar104._0_4_ = fVar207 * auVar52._0_4_;
  auVar104._4_4_ = fVar93 * auVar52._4_4_;
  auVar104._8_4_ = fVar200 * auVar52._8_4_;
  auVar104._12_4_ = fVar202 * auVar52._12_4_;
  auVar39 = vfmadd231ps_fma(auVar104,(undefined1  [16])aVar3,auVar39);
  auVar47 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar2,auVar151);
  auVar52 = vsubps_avx(local_1c8,(undefined1  [16])aVar1);
  uVar94 = auVar52._0_4_;
  auVar162._4_4_ = uVar94;
  auVar162._0_4_ = uVar94;
  auVar162._8_4_ = uVar94;
  auVar162._12_4_ = uVar94;
  auVar39 = vshufps_avx(auVar52,auVar52,0x55);
  auVar52 = vshufps_avx(auVar52,auVar52,0xaa);
  auVar152._0_4_ = fVar207 * auVar52._0_4_;
  auVar152._4_4_ = fVar93 * auVar52._4_4_;
  auVar152._8_4_ = fVar200 * auVar52._8_4_;
  auVar152._12_4_ = fVar202 * auVar52._12_4_;
  auVar39 = vfmadd231ps_fma(auVar152,(undefined1  [16])aVar3,auVar39);
  auVar46 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar2,auVar162);
  auVar52 = vsubps_avx(_local_1b8,(undefined1  [16])aVar1);
  uVar94 = auVar52._0_4_;
  auVar170._4_4_ = uVar94;
  auVar170._0_4_ = uVar94;
  auVar170._8_4_ = uVar94;
  auVar170._12_4_ = uVar94;
  auVar39 = vshufps_avx(auVar52,auVar52,0x55);
  auVar52 = vshufps_avx(auVar52,auVar52,0xaa);
  auVar163._0_4_ = auVar52._0_4_ * fVar207;
  auVar163._4_4_ = auVar52._4_4_ * fVar93;
  auVar163._8_4_ = auVar52._8_4_ * fVar200;
  auVar163._12_4_ = auVar52._12_4_ * fVar202;
  auVar39 = vfmadd231ps_fma(auVar163,(undefined1  [16])aVar3,auVar39);
  auVar42 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar2,auVar170);
  auVar52 = vsubps_avx512vl(_local_208,(undefined1  [16])aVar1);
  uVar94 = auVar52._0_4_;
  auVar181._4_4_ = uVar94;
  auVar181._0_4_ = uVar94;
  auVar181._8_4_ = uVar94;
  auVar181._12_4_ = uVar94;
  auVar39 = vshufps_avx(auVar52,auVar52,0x55);
  auVar52 = vshufps_avx(auVar52,auVar52,0xaa);
  auVar171._0_4_ = auVar52._0_4_ * fVar207;
  auVar171._4_4_ = auVar52._4_4_ * fVar93;
  auVar171._8_4_ = auVar52._8_4_ * fVar200;
  auVar171._12_4_ = auVar52._12_4_ * fVar202;
  auVar39 = vfmadd231ps_fma(auVar171,(undefined1  [16])aVar3,auVar39);
  auVar75._16_16_ = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar2,auVar181);
  auVar52 = vsubps_avx512vl(_local_218,(undefined1  [16])aVar1);
  uVar94 = auVar52._0_4_;
  auVar189._4_4_ = uVar94;
  auVar189._0_4_ = uVar94;
  auVar189._8_4_ = uVar94;
  auVar189._12_4_ = uVar94;
  auVar39 = vshufps_avx(auVar52,auVar52,0x55);
  auVar52 = vshufps_avx(auVar52,auVar52,0xaa);
  auVar182._0_4_ = auVar52._0_4_ * fVar207;
  auVar182._4_4_ = auVar52._4_4_ * fVar93;
  auVar182._8_4_ = auVar52._8_4_ * fVar200;
  auVar182._12_4_ = auVar52._12_4_ * fVar202;
  auVar39 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar3,auVar39);
  auVar40 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar2,auVar189);
  auVar52 = vsubps_avx512vl(_local_1d8,(undefined1  [16])aVar1);
  uVar94 = auVar52._0_4_;
  auVar190._4_4_ = uVar94;
  auVar190._0_4_ = uVar94;
  auVar190._8_4_ = uVar94;
  auVar190._12_4_ = uVar94;
  auVar39 = vshufps_avx(auVar52,auVar52,0x55);
  auVar52 = vshufps_avx(auVar52,auVar52,0xaa);
  auVar123._0_4_ = fVar207 * auVar52._0_4_;
  auVar123._4_4_ = fVar93 * auVar52._4_4_;
  auVar123._8_4_ = fVar200 * auVar52._8_4_;
  auVar123._12_4_ = fVar202 * auVar52._12_4_;
  auVar39 = vfmadd231ps_fma(auVar123,(undefined1  [16])aVar3,auVar39);
  auVar41 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar2,auVar190);
  local_2f8 = vmovlhps_avx512f(auVar49,auVar42);
  auVar241 = ZEXT1664(local_2f8);
  local_318 = vmovlhps_avx512f(auVar48,auVar75._16_16_);
  auVar239 = ZEXT1664(local_318);
  local_268 = vmovlhps_avx(auVar47,auVar40);
  _local_188 = vmovlhps_avx512f(auVar46,auVar41);
  auVar39 = vminps_avx512vl(local_2f8,local_318);
  auVar51 = vmaxps_avx512vl(local_2f8,local_318);
  auVar52 = vminps_avx512vl(local_268,_local_188);
  auVar52 = vminps_avx(auVar39,auVar52);
  auVar39 = vmaxps_avx512vl(local_268,_local_188);
  auVar39 = vmaxps_avx(auVar51,auVar39);
  auVar51 = vshufpd_avx(auVar52,auVar52,3);
  auVar50 = vshufpd_avx(auVar39,auVar39,3);
  auVar52 = vminps_avx(auVar52,auVar51);
  auVar39 = vmaxps_avx(auVar39,auVar50);
  auVar52 = vandps_avx512vl(auVar52,auVar234._0_16_);
  auVar39 = vandps_avx512vl(auVar39,auVar234._0_16_);
  auVar39 = vmaxps_avx(auVar52,auVar39);
  auVar52 = vmovshdup_avx(auVar39);
  auVar39 = vmaxss_avx(auVar52,auVar39);
  local_278._8_8_ = auVar49._0_8_;
  local_278._0_8_ = auVar49._0_8_;
  local_288 = vmovddup_avx512vl(auVar48);
  local_298 = vmovddup_avx512vl(auVar47);
  local_2a8._0_8_ = auVar46._0_8_;
  local_2a8._8_8_ = local_2a8._0_8_;
  register0x00001348 = auVar42._0_8_;
  local_2b8 = auVar42._0_8_;
  register0x00001388 = auVar75._16_8_;
  local_2c8 = auVar75._16_8_;
  register0x00001408 = auVar40._0_8_;
  local_2d8 = auVar40._0_8_;
  register0x00001448 = auVar41._0_8_;
  local_2e8 = auVar41._0_8_;
  local_198 = ZEXT416((uint)(auVar39._0_4_ * 9.536743e-07));
  local_d8 = vbroadcastss_avx512vl(local_198);
  auVar39 = vxorps_avx512vl(local_d8._0_16_,auVar105);
  local_78 = auVar39._0_4_;
  uStack_74 = local_78;
  uStack_70 = local_78;
  uStack_6c = local_78;
  uStack_68 = local_78;
  uStack_64 = local_78;
  uStack_60 = local_78;
  uStack_5c = local_78;
  local_328 = vsubps_avx512vl(local_318,local_2f8);
  local_e8 = vsubps_avx512vl(local_268,local_318);
  local_f8 = vsubps_avx512vl(_local_188,local_268);
  local_108 = vsubps_avx(_local_1b8,local_1a8);
  local_118 = vsubps_avx512vl(_local_208,local_1e8);
  local_128 = vsubps_avx512vl(_local_218,local_1f8);
  _local_138 = vsubps_avx512vl(_local_1d8,local_1c8);
  bVar31 = false;
  auVar39 = ZEXT816(0x3f80000000000000);
  uVar26 = 0;
  auVar40 = auVar39;
LAB_01d31cfb:
  do {
    auVar52 = vshufps_avx(auVar40,auVar40,0x50);
    auVar224._8_4_ = 0x3f800000;
    auVar224._0_8_ = 0x3f8000003f800000;
    auVar224._12_4_ = 0x3f800000;
    auVar227._16_4_ = 0x3f800000;
    auVar227._0_16_ = auVar224;
    auVar227._20_4_ = 0x3f800000;
    auVar227._24_4_ = 0x3f800000;
    auVar227._28_4_ = 0x3f800000;
    auVar51 = vsubps_avx(auVar224,auVar52);
    fVar207 = auVar52._0_4_;
    auVar124._0_4_ = local_2b8._0_4_ * fVar207;
    fVar93 = auVar52._4_4_;
    auVar124._4_4_ = local_2b8._4_4_ * fVar93;
    fVar200 = auVar52._8_4_;
    auVar124._8_4_ = local_2b8._8_4_ * fVar200;
    fVar202 = auVar52._12_4_;
    auVar124._12_4_ = local_2b8._12_4_ * fVar202;
    auVar134._0_4_ = local_2c8._0_4_ * fVar207;
    auVar134._4_4_ = local_2c8._4_4_ * fVar93;
    auVar134._8_4_ = local_2c8._8_4_ * fVar200;
    auVar134._12_4_ = local_2c8._12_4_ * fVar202;
    auVar144._0_4_ = local_2d8._0_4_ * fVar207;
    auVar144._4_4_ = local_2d8._4_4_ * fVar93;
    auVar144._8_4_ = local_2d8._8_4_ * fVar200;
    auVar144._12_4_ = local_2d8._12_4_ * fVar202;
    auVar105._0_4_ = local_2e8._0_4_ * fVar207;
    auVar105._4_4_ = local_2e8._4_4_ * fVar93;
    auVar105._8_4_ = local_2e8._8_4_ * fVar200;
    auVar105._12_4_ = local_2e8._12_4_ * fVar202;
    auVar50 = vfmadd231ps_fma(auVar124,auVar51,local_278);
    auVar49 = vfmadd231ps_avx512vl(auVar134,auVar51,local_288);
    auVar48 = vfmadd231ps_avx512vl(auVar144,auVar51,local_298);
    auVar51 = vfmadd231ps_fma(auVar105,local_2a8,auVar51);
    auVar52 = vmovshdup_avx(auVar39);
    fVar93 = auVar39._0_4_;
    fVar207 = (auVar52._0_4_ - fVar93) * 0.04761905;
    auVar168._4_4_ = fVar93;
    auVar168._0_4_ = fVar93;
    auVar168._8_4_ = fVar93;
    auVar168._12_4_ = fVar93;
    auVar168._16_4_ = fVar93;
    auVar168._20_4_ = fVar93;
    auVar168._24_4_ = fVar93;
    auVar168._28_4_ = fVar93;
    auVar116._0_8_ = auVar52._0_8_;
    auVar116._8_8_ = auVar116._0_8_;
    auVar116._16_8_ = auVar116._0_8_;
    auVar116._24_8_ = auVar116._0_8_;
    auVar62 = vsubps_avx(auVar116,auVar168);
    uVar94 = auVar50._0_4_;
    auVar117._4_4_ = uVar94;
    auVar117._0_4_ = uVar94;
    auVar117._8_4_ = uVar94;
    auVar117._12_4_ = uVar94;
    auVar117._16_4_ = uVar94;
    auVar117._20_4_ = uVar94;
    auVar117._24_4_ = uVar94;
    auVar117._28_4_ = uVar94;
    auVar185._8_4_ = 1;
    auVar185._0_8_ = 0x100000001;
    auVar185._12_4_ = 1;
    auVar185._16_4_ = 1;
    auVar185._20_4_ = 1;
    auVar185._24_4_ = 1;
    auVar185._28_4_ = 1;
    auVar77 = ZEXT1632(auVar50);
    auVar60 = vpermps_avx2(auVar185,auVar77);
    auVar67 = vbroadcastss_avx512vl(auVar49);
    auVar78 = ZEXT1632(auVar49);
    auVar61 = vpermps_avx512vl(auVar185,auVar78);
    auVar68 = vbroadcastss_avx512vl(auVar48);
    auVar75 = ZEXT1632(auVar48);
    auVar69 = vpermps_avx512vl(auVar185,auVar75);
    auVar70 = vbroadcastss_avx512vl(auVar51);
    auVar74 = ZEXT1632(auVar51);
    auVar71 = vpermps_avx512vl(auVar185,auVar74);
    auVar186._4_4_ = fVar207;
    auVar186._0_4_ = fVar207;
    auVar186._8_4_ = fVar207;
    auVar186._12_4_ = fVar207;
    auVar186._16_4_ = fVar207;
    auVar186._20_4_ = fVar207;
    auVar186._24_4_ = fVar207;
    auVar186._28_4_ = fVar207;
    auVar59 = vbroadcastss_avx512vl(ZEXT416(2));
    auVar72 = vpermps_avx512vl(auVar59,auVar77);
    auVar159._8_4_ = 3;
    auVar159._0_8_ = 0x300000003;
    auVar159._12_4_ = 3;
    auVar159._16_4_ = 3;
    auVar159._20_4_ = 3;
    auVar159._24_4_ = 3;
    auVar159._28_4_ = 3;
    auVar73 = vpermps_avx512vl(auVar159,auVar77);
    auVar57 = vpermps_avx512vl(auVar59,auVar78);
    auVar77 = vpermps_avx2(auVar159,auVar78);
    auVar58 = vpermps_avx512vl(auVar59,auVar75);
    auVar78 = vpermps_avx2(auVar159,auVar75);
    auVar59 = vpermps_avx512vl(auVar59,auVar74);
    auVar74 = vpermps_avx512vl(auVar159,auVar74);
    auVar52 = vfmadd132ps_fma(auVar62,auVar168,_DAT_01faff20);
    auVar62 = vsubps_avx(auVar227,ZEXT1632(auVar52));
    auVar75 = vmulps_avx512vl(auVar67,ZEXT1632(auVar52));
    auVar79 = ZEXT1632(auVar52);
    auVar76 = vmulps_avx512vl(auVar61,auVar79);
    auVar51 = vfmadd231ps_fma(auVar75,auVar62,auVar117);
    auVar50 = vfmadd231ps_fma(auVar76,auVar62,auVar60);
    auVar75 = vmulps_avx512vl(auVar68,auVar79);
    auVar76 = vmulps_avx512vl(auVar69,auVar79);
    auVar67 = vfmadd231ps_avx512vl(auVar75,auVar62,auVar67);
    auVar61 = vfmadd231ps_avx512vl(auVar76,auVar62,auVar61);
    auVar75 = vmulps_avx512vl(auVar70,auVar79);
    auVar76 = ZEXT1632(auVar52);
    auVar71 = vmulps_avx512vl(auVar71,auVar76);
    auVar68 = vfmadd231ps_avx512vl(auVar75,auVar62,auVar68);
    auVar69 = vfmadd231ps_avx512vl(auVar71,auVar62,auVar69);
    fVar200 = auVar52._0_4_;
    fVar202 = auVar52._4_4_;
    auVar17._4_4_ = fVar202 * auVar67._4_4_;
    auVar17._0_4_ = fVar200 * auVar67._0_4_;
    fVar204 = auVar52._8_4_;
    auVar17._8_4_ = fVar204 * auVar67._8_4_;
    fVar205 = auVar52._12_4_;
    auVar17._12_4_ = fVar205 * auVar67._12_4_;
    auVar17._16_4_ = auVar67._16_4_ * 0.0;
    auVar17._20_4_ = auVar67._20_4_ * 0.0;
    auVar17._24_4_ = auVar67._24_4_ * 0.0;
    auVar17._28_4_ = fVar93;
    auVar18._4_4_ = fVar202 * auVar61._4_4_;
    auVar18._0_4_ = fVar200 * auVar61._0_4_;
    auVar18._8_4_ = fVar204 * auVar61._8_4_;
    auVar18._12_4_ = fVar205 * auVar61._12_4_;
    auVar18._16_4_ = auVar61._16_4_ * 0.0;
    auVar18._20_4_ = auVar61._20_4_ * 0.0;
    auVar18._24_4_ = auVar61._24_4_ * 0.0;
    auVar18._28_4_ = auVar60._28_4_;
    auVar51 = vfmadd231ps_fma(auVar17,auVar62,ZEXT1632(auVar51));
    auVar50 = vfmadd231ps_fma(auVar18,auVar62,ZEXT1632(auVar50));
    auVar109._0_4_ = fVar200 * auVar68._0_4_;
    auVar109._4_4_ = fVar202 * auVar68._4_4_;
    auVar109._8_4_ = fVar204 * auVar68._8_4_;
    auVar109._12_4_ = fVar205 * auVar68._12_4_;
    auVar109._16_4_ = auVar68._16_4_ * 0.0;
    auVar109._20_4_ = auVar68._20_4_ * 0.0;
    auVar109._24_4_ = auVar68._24_4_ * 0.0;
    auVar109._28_4_ = 0;
    auVar19._4_4_ = fVar202 * auVar69._4_4_;
    auVar19._0_4_ = fVar200 * auVar69._0_4_;
    auVar19._8_4_ = fVar204 * auVar69._8_4_;
    auVar19._12_4_ = fVar205 * auVar69._12_4_;
    auVar19._16_4_ = auVar69._16_4_ * 0.0;
    auVar19._20_4_ = auVar69._20_4_ * 0.0;
    auVar19._24_4_ = auVar69._24_4_ * 0.0;
    auVar19._28_4_ = auVar68._28_4_;
    auVar49 = vfmadd231ps_fma(auVar109,auVar62,auVar67);
    auVar48 = vfmadd231ps_fma(auVar19,auVar62,auVar61);
    auVar20._28_4_ = auVar61._28_4_;
    auVar20._0_28_ =
         ZEXT1628(CONCAT412(fVar205 * auVar48._12_4_,
                            CONCAT48(fVar204 * auVar48._8_4_,
                                     CONCAT44(fVar202 * auVar48._4_4_,fVar200 * auVar48._0_4_))));
    auVar47 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar205 * auVar49._12_4_,
                                                 CONCAT48(fVar204 * auVar49._8_4_,
                                                          CONCAT44(fVar202 * auVar49._4_4_,
                                                                   fVar200 * auVar49._0_4_)))),
                              auVar62,ZEXT1632(auVar51));
    auVar46 = vfmadd231ps_fma(auVar20,auVar62,ZEXT1632(auVar50));
    auVar60 = vsubps_avx(ZEXT1632(auVar49),ZEXT1632(auVar51));
    auVar67 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar50));
    auVar61 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar60 = vmulps_avx512vl(auVar60,auVar61);
    auVar67 = vmulps_avx512vl(auVar67,auVar61);
    auVar180._0_4_ = fVar207 * auVar60._0_4_;
    auVar180._4_4_ = fVar207 * auVar60._4_4_;
    auVar180._8_4_ = fVar207 * auVar60._8_4_;
    auVar180._12_4_ = fVar207 * auVar60._12_4_;
    auVar180._16_4_ = fVar207 * auVar60._16_4_;
    auVar180._20_4_ = fVar207 * auVar60._20_4_;
    auVar180._24_4_ = fVar207 * auVar60._24_4_;
    auVar180._28_4_ = 0;
    auVar60 = vmulps_avx512vl(auVar186,auVar67);
    auVar50 = vxorps_avx512vl(auVar70._0_16_,auVar70._0_16_);
    auVar67 = vpermt2ps_avx512vl(ZEXT1632(auVar47),_DAT_01feed00,ZEXT1632(auVar50));
    auVar68 = vpermt2ps_avx512vl(ZEXT1632(auVar46),_DAT_01feed00,ZEXT1632(auVar50));
    auVar110._0_4_ = auVar180._0_4_ + auVar47._0_4_;
    auVar110._4_4_ = auVar180._4_4_ + auVar47._4_4_;
    auVar110._8_4_ = auVar180._8_4_ + auVar47._8_4_;
    auVar110._12_4_ = auVar180._12_4_ + auVar47._12_4_;
    auVar110._16_4_ = auVar180._16_4_ + 0.0;
    auVar110._20_4_ = auVar180._20_4_ + 0.0;
    auVar110._24_4_ = auVar180._24_4_ + 0.0;
    auVar110._28_4_ = 0;
    auVar79 = ZEXT1632(auVar50);
    auVar69 = vpermt2ps_avx512vl(auVar180,_DAT_01feed00,auVar79);
    auVar70 = vaddps_avx512vl(ZEXT1632(auVar46),auVar60);
    auVar71 = vpermt2ps_avx512vl(auVar60,_DAT_01feed00,auVar79);
    auVar60 = vsubps_avx(auVar67,auVar69);
    auVar69 = vsubps_avx512vl(auVar68,auVar71);
    auVar71 = vmulps_avx512vl(auVar57,auVar76);
    auVar75 = vmulps_avx512vl(auVar77,auVar76);
    auVar71 = vfmadd231ps_avx512vl(auVar71,auVar62,auVar72);
    auVar72 = vfmadd231ps_avx512vl(auVar75,auVar62,auVar73);
    auVar73 = vmulps_avx512vl(auVar58,auVar76);
    auVar75 = vmulps_avx512vl(auVar78,auVar76);
    auVar73 = vfmadd231ps_avx512vl(auVar73,auVar62,auVar57);
    auVar77 = vfmadd231ps_avx512vl(auVar75,auVar62,auVar77);
    auVar59 = vmulps_avx512vl(auVar59,auVar76);
    auVar57 = vmulps_avx512vl(auVar74,auVar76);
    auVar51 = vfmadd231ps_fma(auVar59,auVar62,auVar58);
    auVar59 = vfmadd231ps_avx512vl(auVar57,auVar62,auVar78);
    auVar57 = vmulps_avx512vl(auVar76,auVar73);
    auVar74 = ZEXT1632(auVar52);
    auVar58 = vmulps_avx512vl(auVar74,auVar77);
    auVar71 = vfmadd231ps_avx512vl(auVar57,auVar62,auVar71);
    auVar72 = vfmadd231ps_avx512vl(auVar58,auVar62,auVar72);
    auVar59 = vmulps_avx512vl(auVar74,auVar59);
    auVar73 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar205 * auVar51._12_4_,
                                            CONCAT48(fVar204 * auVar51._8_4_,
                                                     CONCAT44(fVar202 * auVar51._4_4_,
                                                              fVar200 * auVar51._0_4_)))),auVar62,
                         auVar73);
    auVar77 = vfmadd231ps_avx512vl(auVar59,auVar62,auVar77);
    auVar21._4_4_ = fVar202 * auVar73._4_4_;
    auVar21._0_4_ = fVar200 * auVar73._0_4_;
    auVar21._8_4_ = fVar204 * auVar73._8_4_;
    auVar21._12_4_ = fVar205 * auVar73._12_4_;
    auVar21._16_4_ = auVar73._16_4_ * 0.0;
    auVar21._20_4_ = auVar73._20_4_ * 0.0;
    auVar21._24_4_ = auVar73._24_4_ * 0.0;
    auVar21._28_4_ = auVar78._28_4_;
    auVar78 = vmulps_avx512vl(auVar74,auVar77);
    auVar59 = vfmadd231ps_avx512vl(auVar21,auVar62,auVar71);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar72,auVar62);
    auVar62 = vsubps_avx512vl(auVar73,auVar71);
    auVar77 = vsubps_avx512vl(auVar77,auVar72);
    auVar62 = vmulps_avx512vl(auVar62,auVar61);
    auVar77 = vmulps_avx512vl(auVar77,auVar61);
    fVar93 = fVar207 * auVar62._0_4_;
    fVar200 = fVar207 * auVar62._4_4_;
    auVar22._4_4_ = fVar200;
    auVar22._0_4_ = fVar93;
    fVar202 = fVar207 * auVar62._8_4_;
    auVar22._8_4_ = fVar202;
    fVar204 = fVar207 * auVar62._12_4_;
    auVar22._12_4_ = fVar204;
    fVar205 = fVar207 * auVar62._16_4_;
    auVar22._16_4_ = fVar205;
    fVar206 = fVar207 * auVar62._20_4_;
    auVar22._20_4_ = fVar206;
    fVar207 = fVar207 * auVar62._24_4_;
    auVar22._24_4_ = fVar207;
    auVar22._28_4_ = auVar62._28_4_;
    auVar77 = vmulps_avx512vl(auVar186,auVar77);
    auVar61 = vpermt2ps_avx512vl(auVar59,_DAT_01feed00,auVar79);
    auVar71 = vpermt2ps_avx512vl(auVar78,_DAT_01feed00,auVar79);
    auVar187._0_4_ = auVar59._0_4_ + fVar93;
    auVar187._4_4_ = auVar59._4_4_ + fVar200;
    auVar187._8_4_ = auVar59._8_4_ + fVar202;
    auVar187._12_4_ = auVar59._12_4_ + fVar204;
    auVar187._16_4_ = auVar59._16_4_ + fVar205;
    auVar187._20_4_ = auVar59._20_4_ + fVar206;
    auVar187._24_4_ = auVar59._24_4_ + fVar207;
    auVar187._28_4_ = auVar59._28_4_ + auVar62._28_4_;
    auVar62 = vpermt2ps_avx512vl(auVar22,_DAT_01feed00,ZEXT1632(auVar50));
    auVar72 = vaddps_avx512vl(auVar78,auVar77);
    auVar77 = vpermt2ps_avx512vl(auVar77,_DAT_01feed00,ZEXT1632(auVar50));
    auVar62 = vsubps_avx(auVar61,auVar62);
    auVar77 = vsubps_avx512vl(auVar71,auVar77);
    in_ZMM17 = ZEXT3264(auVar77);
    auVar127 = ZEXT1632(auVar47);
    auVar73 = vsubps_avx512vl(auVar59,auVar127);
    auVar140 = ZEXT1632(auVar46);
    auVar57 = vsubps_avx512vl(auVar78,auVar140);
    auVar58 = vsubps_avx512vl(auVar61,auVar67);
    auVar73 = vaddps_avx512vl(auVar73,auVar58);
    auVar58 = vsubps_avx512vl(auVar71,auVar68);
    auVar57 = vaddps_avx512vl(auVar57,auVar58);
    auVar58 = vmulps_avx512vl(auVar140,auVar73);
    auVar58 = vfnmadd231ps_avx512vl(auVar58,auVar127,auVar57);
    auVar74 = vmulps_avx512vl(auVar70,auVar73);
    auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar110,auVar57);
    auVar75 = vmulps_avx512vl(auVar69,auVar73);
    auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar60,auVar57);
    auVar76 = vmulps_avx512vl(auVar68,auVar73);
    auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar67,auVar57);
    auVar79 = vmulps_avx512vl(auVar78,auVar73);
    auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar59,auVar57);
    auVar80 = vmulps_avx512vl(auVar72,auVar73);
    auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar187,auVar57);
    auVar81 = vmulps_avx512vl(auVar77,auVar73);
    auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar62,auVar57);
    auVar73 = vmulps_avx512vl(auVar71,auVar73);
    auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar61,auVar57);
    auVar57 = vminps_avx512vl(auVar58,auVar74);
    auVar58 = vmaxps_avx512vl(auVar58,auVar74);
    auVar74 = vminps_avx512vl(auVar75,auVar76);
    auVar57 = vminps_avx512vl(auVar57,auVar74);
    auVar74 = vmaxps_avx512vl(auVar75,auVar76);
    auVar58 = vmaxps_avx512vl(auVar58,auVar74);
    auVar74 = vminps_avx512vl(auVar79,auVar80);
    auVar75 = vmaxps_avx512vl(auVar79,auVar80);
    auVar76 = vminps_avx512vl(auVar81,auVar73);
    auVar74 = vminps_avx512vl(auVar74,auVar76);
    auVar57 = vminps_avx512vl(auVar57,auVar74);
    auVar73 = vmaxps_avx512vl(auVar81,auVar73);
    auVar73 = vmaxps_avx512vl(auVar75,auVar73);
    auVar73 = vmaxps_avx512vl(auVar58,auVar73);
    uVar9 = vcmpps_avx512vl(auVar57,local_d8,2);
    auVar23._4_4_ = uStack_74;
    auVar23._0_4_ = local_78;
    auVar23._8_4_ = uStack_70;
    auVar23._12_4_ = uStack_6c;
    auVar23._16_4_ = uStack_68;
    auVar23._20_4_ = uStack_64;
    auVar23._24_4_ = uStack_60;
    auVar23._28_4_ = uStack_5c;
    uVar10 = vcmpps_avx512vl(auVar73,auVar23,5);
    bVar24 = (byte)uVar9 & (byte)uVar10 & 0x7f;
    if (bVar24 != 0) {
      auVar73 = vsubps_avx512vl(auVar67,auVar127);
      auVar57 = vsubps_avx512vl(auVar68,auVar140);
      auVar58 = vsubps_avx512vl(auVar61,auVar59);
      auVar73 = vaddps_avx512vl(auVar73,auVar58);
      auVar58 = vsubps_avx512vl(auVar71,auVar78);
      auVar57 = vaddps_avx512vl(auVar57,auVar58);
      auVar58 = vmulps_avx512vl(auVar140,auVar73);
      auVar58 = vfnmadd231ps_avx512vl(auVar58,auVar57,auVar127);
      auVar70 = vmulps_avx512vl(auVar70,auVar73);
      auVar70 = vfnmadd213ps_avx512vl(auVar110,auVar57,auVar70);
      auVar69 = vmulps_avx512vl(auVar69,auVar73);
      auVar69 = vfnmadd213ps_avx512vl(auVar60,auVar57,auVar69);
      auVar60 = vmulps_avx512vl(auVar68,auVar73);
      auVar68 = vfnmadd231ps_avx512vl(auVar60,auVar57,auVar67);
      auVar60 = vmulps_avx512vl(auVar78,auVar73);
      auVar78 = vfnmadd231ps_avx512vl(auVar60,auVar57,auVar59);
      auVar60 = vmulps_avx512vl(auVar72,auVar73);
      auVar59 = vfnmadd213ps_avx512vl(auVar187,auVar57,auVar60);
      auVar60 = vmulps_avx512vl(auVar77,auVar73);
      auVar72 = vfnmadd213ps_avx512vl(auVar62,auVar57,auVar60);
      auVar62 = vmulps_avx512vl(auVar71,auVar73);
      auVar61 = vfnmadd231ps_avx512vl(auVar62,auVar61,auVar57);
      auVar60 = vminps_avx(auVar58,auVar70);
      auVar62 = vmaxps_avx(auVar58,auVar70);
      auVar67 = vminps_avx(auVar69,auVar68);
      auVar67 = vminps_avx(auVar60,auVar67);
      auVar60 = vmaxps_avx(auVar69,auVar68);
      auVar62 = vmaxps_avx(auVar62,auVar60);
      auVar77 = vminps_avx(auVar78,auVar59);
      auVar60 = vmaxps_avx(auVar78,auVar59);
      auVar78 = vminps_avx(auVar72,auVar61);
      auVar77 = vminps_avx(auVar77,auVar78);
      auVar77 = vminps_avx(auVar67,auVar77);
      auVar67 = vmaxps_avx(auVar72,auVar61);
      auVar60 = vmaxps_avx(auVar60,auVar67);
      auVar62 = vmaxps_avx(auVar62,auVar60);
      uVar9 = vcmpps_avx512vl(auVar62,auVar23,5);
      uVar10 = vcmpps_avx512vl(auVar77,local_d8,2);
      bVar24 = bVar24 & (byte)uVar9 & (byte)uVar10;
      if (bVar24 != 0) {
        auStack_178[uVar26] = (uint)bVar24;
        uVar9 = vmovlps_avx(auVar39);
        (&uStack_b8)[uVar26] = uVar9;
        uVar32 = vmovlps_avx(auVar40);
        auStack_58[uVar26] = uVar32;
        uVar26 = (ulong)((int)uVar26 + 1);
      }
    }
    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar233 = ZEXT1664(auVar39);
    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar234 = ZEXT1664(auVar39);
    auVar62 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar235 = ZEXT3264(auVar62);
    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar236 = ZEXT1664(auVar39);
    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar237 = ZEXT1664(auVar39);
    auVar238 = ZEXT3264(_DAT_01feed20);
    auVar75._16_16_ = DAT_01feed20._16_16_;
    auVar240 = ZEXT1664(local_328);
LAB_01d32205:
    do {
      do {
        do {
          if ((int)uVar26 == 0) {
            if (bVar31) {
              return bVar31;
            }
            fVar207 = ray->tfar;
            auVar16._4_4_ = fVar207;
            auVar16._0_4_ = fVar207;
            auVar16._8_4_ = fVar207;
            auVar16._12_4_ = fVar207;
            auVar16._16_4_ = fVar207;
            auVar16._20_4_ = fVar207;
            auVar16._24_4_ = fVar207;
            auVar16._28_4_ = fVar207;
            uVar9 = vcmpps_avx512vl(local_98,auVar16,2);
            uVar33 = (uint)uVar34 & (uint)uVar9;
            uVar34 = (ulong)uVar33;
            if (uVar33 == 0) {
              return bVar31;
            }
            goto LAB_01d3163a;
          }
          uVar25 = (int)uVar26 - 1;
          uVar27 = (ulong)uVar25;
          uVar33 = auStack_178[uVar27];
          auVar40._8_8_ = 0;
          auVar40._0_8_ = auStack_58[uVar27];
          uVar32 = 0;
          for (uVar30 = (ulong)uVar33; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000)
          {
            uVar32 = uVar32 + 1;
          }
          uVar29 = uVar33 - 1 & uVar33;
          bVar37 = uVar29 == 0;
          auStack_178[uVar27] = uVar29;
          if (bVar37) {
            uVar26 = (ulong)uVar25;
          }
          auVar95._8_8_ = 0;
          auVar95._0_8_ = uVar32;
          auVar39 = vpunpcklqdq_avx(auVar95,ZEXT416((int)uVar32 + 1));
          auVar39 = vcvtqq2ps_avx512vl(auVar39);
          auVar39 = vmulps_avx512vl(auVar39,auVar236._0_16_);
          uVar94 = *(undefined4 *)((long)&uStack_b8 + uVar27 * 8 + 4);
          auVar11._4_4_ = uVar94;
          auVar11._0_4_ = uVar94;
          auVar11._8_4_ = uVar94;
          auVar11._12_4_ = uVar94;
          auVar52 = vmulps_avx512vl(auVar39,auVar11);
          auVar51 = auVar237._0_16_;
          auVar39 = vsubps_avx512vl(auVar51,auVar39);
          uVar94 = *(undefined4 *)(&uStack_b8 + uVar27);
          auVar12._4_4_ = uVar94;
          auVar12._0_4_ = uVar94;
          auVar12._8_4_ = uVar94;
          auVar12._12_4_ = uVar94;
          auVar39 = vfmadd231ps_avx512vl(auVar52,auVar39,auVar12);
          auVar52 = vmovshdup_avx(auVar39);
          fVar207 = auVar52._0_4_ - auVar39._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar207));
          if (uVar33 == 0 || bVar37) goto LAB_01d31cfb;
          auVar52 = vshufps_avx(auVar40,auVar40,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar207));
          auVar48 = vsubps_avx512vl(auVar51,auVar52);
          fVar93 = auVar52._0_4_;
          auVar135._0_4_ = fVar93 * (float)local_2b8._0_4_;
          fVar200 = auVar52._4_4_;
          auVar135._4_4_ = fVar200 * (float)local_2b8._4_4_;
          fVar202 = auVar52._8_4_;
          auVar135._8_4_ = fVar202 * fStack_2b0;
          fVar204 = auVar52._12_4_;
          auVar135._12_4_ = fVar204 * fStack_2ac;
          auVar145._0_4_ = fVar93 * (float)local_2c8._0_4_;
          auVar145._4_4_ = fVar200 * (float)local_2c8._4_4_;
          auVar145._8_4_ = fVar202 * fStack_2c0;
          auVar145._12_4_ = fVar204 * fStack_2bc;
          auVar153._0_4_ = fVar93 * (float)local_2d8._0_4_;
          auVar153._4_4_ = fVar200 * (float)local_2d8._4_4_;
          auVar153._8_4_ = fVar202 * fStack_2d0;
          auVar153._12_4_ = fVar204 * fStack_2cc;
          auVar112._0_4_ = fVar93 * (float)local_2e8._0_4_;
          auVar112._4_4_ = fVar200 * (float)local_2e8._4_4_;
          auVar112._8_4_ = fVar202 * fStack_2e0;
          auVar112._12_4_ = fVar204 * fStack_2dc;
          auVar52 = vfmadd231ps_fma(auVar135,auVar48,local_278);
          auVar50 = vfmadd231ps_fma(auVar145,auVar48,local_288);
          auVar49 = vfmadd231ps_fma(auVar153,auVar48,local_298);
          auVar48 = vfmadd231ps_fma(auVar112,auVar48,local_2a8);
          auVar128._16_16_ = auVar52;
          auVar128._0_16_ = auVar52;
          auVar141._16_16_ = auVar50;
          auVar141._0_16_ = auVar50;
          auVar149._16_16_ = auVar49;
          auVar149._0_16_ = auVar49;
          auVar60 = vpermps_avx512vl(auVar238._0_32_,ZEXT1632(auVar39));
          auVar62 = vsubps_avx(auVar141,auVar128);
          auVar50 = vfmadd213ps_fma(auVar62,auVar60,auVar128);
          auVar62 = vsubps_avx(auVar149,auVar141);
          auVar47 = vfmadd213ps_fma(auVar62,auVar60,auVar141);
          auVar52 = vsubps_avx(auVar48,auVar49);
          auVar142._16_16_ = auVar52;
          auVar142._0_16_ = auVar52;
          auVar52 = vfmadd213ps_fma(auVar142,auVar60,auVar149);
          auVar62 = vsubps_avx(ZEXT1632(auVar47),ZEXT1632(auVar50));
          auVar50 = vfmadd213ps_fma(auVar62,auVar60,ZEXT1632(auVar50));
          auVar62 = vsubps_avx(ZEXT1632(auVar52),ZEXT1632(auVar47));
          auVar52 = vfmadd213ps_fma(auVar62,auVar60,ZEXT1632(auVar47));
          auVar62 = vsubps_avx(ZEXT1632(auVar52),ZEXT1632(auVar50));
          auVar100 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar62,auVar60);
          auVar62 = vmulps_avx512vl(auVar62,auVar235._0_32_);
          auVar75._16_16_ = auVar62._16_16_;
          auVar52 = vmulss_avx512f(ZEXT416((uint)fVar207),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar93 = auVar52._0_4_;
          auVar154._0_8_ =
               CONCAT44(auVar100._4_4_ + fVar93 * auVar62._4_4_,
                        auVar100._0_4_ + fVar93 * auVar62._0_4_);
          auVar154._8_4_ = auVar100._8_4_ + fVar93 * auVar62._8_4_;
          auVar154._12_4_ = auVar100._12_4_ + fVar93 * auVar62._12_4_;
          auVar136._0_4_ = fVar93 * auVar62._16_4_;
          auVar136._4_4_ = fVar93 * auVar62._20_4_;
          auVar136._8_4_ = fVar93 * auVar62._24_4_;
          auVar136._12_4_ = fVar93 * auVar62._28_4_;
          auVar43 = vsubps_avx((undefined1  [16])0x0,auVar136);
          auVar47 = vshufpd_avx(auVar100,auVar100,3);
          auVar46 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar52 = vsubps_avx(auVar47,auVar100);
          auVar50 = vsubps_avx(auVar46,(undefined1  [16])0x0);
          auVar172._0_4_ = auVar52._0_4_ + auVar50._0_4_;
          auVar172._4_4_ = auVar52._4_4_ + auVar50._4_4_;
          auVar172._8_4_ = auVar52._8_4_ + auVar50._8_4_;
          auVar172._12_4_ = auVar52._12_4_ + auVar50._12_4_;
          auVar52 = vshufps_avx(auVar100,auVar100,0xb1);
          auVar50 = vshufps_avx(auVar154,auVar154,0xb1);
          auVar49 = vshufps_avx(auVar43,auVar43,0xb1);
          auVar48 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar225._4_4_ = auVar172._0_4_;
          auVar225._0_4_ = auVar172._0_4_;
          auVar225._8_4_ = auVar172._0_4_;
          auVar225._12_4_ = auVar172._0_4_;
          auVar42 = vshufps_avx(auVar172,auVar172,0x55);
          fVar93 = auVar42._0_4_;
          auVar183._0_4_ = auVar52._0_4_ * fVar93;
          fVar200 = auVar42._4_4_;
          auVar183._4_4_ = auVar52._4_4_ * fVar200;
          fVar202 = auVar42._8_4_;
          auVar183._8_4_ = auVar52._8_4_ * fVar202;
          fVar204 = auVar42._12_4_;
          auVar183._12_4_ = auVar52._12_4_ * fVar204;
          auVar191._0_4_ = auVar50._0_4_ * fVar93;
          auVar191._4_4_ = auVar50._4_4_ * fVar200;
          auVar191._8_4_ = auVar50._8_4_ * fVar202;
          auVar191._12_4_ = auVar50._12_4_ * fVar204;
          auVar210._0_4_ = auVar49._0_4_ * fVar93;
          auVar210._4_4_ = auVar49._4_4_ * fVar200;
          auVar210._8_4_ = auVar49._8_4_ * fVar202;
          auVar210._12_4_ = auVar49._12_4_ * fVar204;
          auVar173._0_4_ = auVar48._0_4_ * fVar93;
          auVar173._4_4_ = auVar48._4_4_ * fVar200;
          auVar173._8_4_ = auVar48._8_4_ * fVar202;
          auVar173._12_4_ = auVar48._12_4_ * fVar204;
          auVar52 = vfmadd231ps_fma(auVar183,auVar225,auVar100);
          auVar50 = vfmadd231ps_fma(auVar191,auVar225,auVar154);
          auVar44 = vfmadd231ps_fma(auVar210,auVar225,auVar43);
          auVar45 = vfmadd231ps_fma(auVar173,(undefined1  [16])0x0,auVar225);
          auVar42 = vshufpd_avx(auVar52,auVar52,1);
          auVar41 = vshufpd_avx(auVar50,auVar50,1);
          auVar53 = vshufpd_avx512vl(auVar44,auVar44,1);
          auVar54 = vshufpd_avx512vl(auVar45,auVar45,1);
          in_ZMM17 = ZEXT1664(auVar54);
          auVar49 = vminss_avx(auVar52,auVar50);
          auVar52 = vmaxss_avx(auVar50,auVar52);
          auVar48 = vminss_avx(auVar44,auVar45);
          auVar50 = vmaxss_avx(auVar45,auVar44);
          auVar49 = vminss_avx(auVar49,auVar48);
          auVar52 = vmaxss_avx(auVar50,auVar52);
          auVar48 = vminss_avx(auVar42,auVar41);
          auVar50 = vmaxss_avx(auVar41,auVar42);
          auVar42 = vminss_avx512f(auVar53,auVar54);
          auVar41 = vmaxss_avx512f(auVar54,auVar53);
          auVar50 = vmaxss_avx(auVar41,auVar50);
          auVar48 = vminss_avx512f(auVar48,auVar42);
          fVar200 = auVar50._0_4_;
          fVar93 = auVar52._0_4_;
          if (auVar49._0_4_ < 0.0001) {
            bVar38 = fVar200 == -0.0001;
            bVar35 = NAN(fVar200);
            if (fVar200 <= -0.0001) goto LAB_01d32437;
            break;
          }
LAB_01d32437:
          vucomiss_avx512f(auVar48);
          bVar38 = fVar200 <= -0.0001;
          bVar36 = -0.0001 < fVar93;
          bVar35 = bVar38;
          if (!bVar38) break;
          uVar9 = vcmpps_avx512vl(auVar49,SUB6416(ZEXT464(0x38d1b717),0),5);
          uVar10 = vcmpps_avx512vl(auVar48,SUB6416(ZEXT464(0x38d1b717),0),5);
          bVar24 = (byte)uVar9 & (byte)uVar10 & 1;
          bVar38 = bVar36 && bVar24 == 0;
          bVar35 = bVar36 && bVar24 == 0;
        } while (!bVar36 || bVar24 != 0);
        auVar44 = vxorps_avx512vl(auVar239._0_16_,auVar239._0_16_);
        vcmpss_avx512f(auVar49,auVar44,1);
        uVar9 = vcmpss_avx512f(auVar52,auVar44,1);
        bVar36 = (bool)((byte)uVar9 & 1);
        auVar75._0_16_ = auVar242._0_16_;
        auVar82._4_28_ = auVar75._4_28_;
        auVar82._0_4_ = (float)((uint)bVar36 * -0x40800000 + (uint)!bVar36 * auVar242._0_4_);
        vucomiss_avx512f(auVar82._0_16_);
        bVar35 = (bool)(!bVar38 | bVar35);
        bVar36 = bVar35 == false;
        auVar84._16_16_ = auVar75._16_16_;
        auVar84._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar83._4_28_ = auVar84._4_28_;
        auVar83._0_4_ = (uint)bVar35 * auVar44._0_4_ + (uint)!bVar35 * 0x7f800000;
        auVar41 = auVar83._0_16_;
        auVar86._16_16_ = auVar75._16_16_;
        auVar86._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar85._4_28_ = auVar86._4_28_;
        auVar85._0_4_ = (uint)bVar35 * auVar44._0_4_ + (uint)!bVar35 * -0x800000;
        auVar42 = auVar85._0_16_;
        auVar45 = vxorps_avx512vl(auVar241._0_16_,auVar241._0_16_);
        uVar9 = vcmpss_avx512f(auVar48,auVar44,1);
        bVar38 = (bool)((byte)uVar9 & 1);
        auVar88._16_16_ = auVar75._16_16_;
        auVar88._0_16_ = auVar242._0_16_;
        auVar87._4_28_ = auVar88._4_28_;
        auVar87._0_4_ = (float)((uint)bVar38 * -0x40800000 + (uint)!bVar38 * auVar242._0_4_);
        auVar44 = vucomiss_avx512f(auVar87._0_16_);
        in_ZMM17 = ZEXT1664(auVar44);
        if ((bVar35) || (bVar36)) {
          auVar48 = vucomiss_avx512f(auVar49);
          if ((bVar35) || (bVar36)) {
            auVar15._8_4_ = 0x80000000;
            auVar15._0_8_ = 0x8000000080000000;
            auVar15._12_4_ = 0x80000000;
            auVar44 = vxorps_avx512vl(auVar49,auVar15);
            in_ZMM17 = ZEXT1664(auVar44);
            auVar49 = vsubss_avx512f(auVar48,auVar49);
            auVar49 = vdivss_avx512f(auVar44,auVar49);
            auVar48 = vsubss_avx512f(ZEXT416(0x3f800000),auVar49);
            auVar48 = vfmadd213ss_avx512f(auVar48,auVar45,auVar49);
            auVar49 = auVar48;
          }
          else {
            auVar48 = vxorps_avx512vl(auVar48,auVar48);
            vucomiss_avx512f(auVar48);
            if ((bVar35) || (auVar49 = ZEXT416(0x3f800000), bVar36)) {
              auVar48 = ZEXT416(0x7f800000);
              auVar49 = SUB6416(ZEXT464(0xff800000),0);
            }
          }
          auVar41 = vminss_avx512f(auVar41,auVar48);
          auVar42 = vmaxss_avx(auVar49,auVar42);
        }
        auVar242 = ZEXT464(0x3f800000);
        auVar241 = ZEXT1664(local_2f8);
        auVar239 = ZEXT1664(local_318);
        auVar49 = vxorps_avx512vl(auVar48,auVar48);
        uVar9 = vcmpss_avx512f(auVar50,auVar49,1);
        bVar38 = (bool)((byte)uVar9 & 1);
        auVar50 = auVar242._0_16_;
        fVar202 = (float)((uint)bVar38 * -0x40800000 + (uint)!bVar38 * 0x3f800000);
        if ((auVar82._0_4_ != fVar202) || (NAN(auVar82._0_4_) || NAN(fVar202))) {
          if ((fVar200 != fVar93) || (NAN(fVar200) || NAN(fVar93))) {
            auVar14._8_4_ = 0x80000000;
            auVar14._0_8_ = 0x8000000080000000;
            auVar14._12_4_ = 0x80000000;
            auVar52 = vxorps_avx512vl(auVar52,auVar14);
            auVar174._0_4_ = auVar52._0_4_ / (fVar200 - fVar93);
            auVar174._4_12_ = auVar52._4_12_;
            auVar52 = vsubss_avx512f(auVar50,auVar174);
            auVar52 = vfmadd213ss_avx512f(auVar52,auVar49,auVar174);
            auVar48 = auVar52;
          }
          else if ((fVar93 != 0.0) ||
                  (auVar52 = auVar50, auVar48 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar93))) {
            auVar52 = SUB6416(ZEXT464(0xff800000),0);
            auVar48 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar41 = vminss_avx(auVar41,auVar48);
          auVar42 = vmaxss_avx(auVar52,auVar42);
        }
        bVar38 = auVar87._0_4_ != fVar202;
        auVar52 = vminss_avx512f(auVar41,auVar50);
        auVar90._16_16_ = auVar75._16_16_;
        auVar90._0_16_ = auVar41;
        auVar89._4_28_ = auVar90._4_28_;
        auVar89._0_4_ = (uint)bVar38 * auVar52._0_4_ + (uint)!bVar38 * auVar41._0_4_;
        auVar52 = vmaxss_avx512f(auVar50,auVar42);
        auVar92._16_16_ = auVar75._16_16_;
        auVar92._0_16_ = auVar42;
        auVar91._4_28_ = auVar92._4_28_;
        auVar91._0_4_ = (uint)bVar38 * auVar52._0_4_ + (uint)!bVar38 * auVar42._0_4_;
        auVar52 = vmaxss_avx512f(auVar49,auVar89._0_16_);
        auVar48 = vminss_avx512f(auVar91._0_16_,auVar50);
      } while (auVar48._0_4_ < auVar52._0_4_);
      auVar44 = vmaxss_avx512f(auVar49,ZEXT416((uint)(auVar52._0_4_ + -0.1)));
      auVar45 = vminss_avx512f(ZEXT416((uint)(auVar48._0_4_ + 0.1)),auVar50);
      auVar113._0_8_ = auVar100._0_8_;
      auVar113._8_8_ = auVar113._0_8_;
      auVar192._8_8_ = auVar154._0_8_;
      auVar192._0_8_ = auVar154._0_8_;
      auVar211._8_8_ = auVar43._0_8_;
      auVar211._0_8_ = auVar43._0_8_;
      auVar52 = vshufpd_avx(auVar154,auVar154,3);
      auVar49 = vshufpd_avx(auVar43,auVar43,3);
      auVar48 = vshufps_avx(auVar44,auVar45,0);
      auVar43 = vsubps_avx512vl(auVar51,auVar48);
      fVar93 = auVar48._0_4_;
      auVar146._0_4_ = fVar93 * auVar47._0_4_;
      fVar200 = auVar48._4_4_;
      auVar146._4_4_ = fVar200 * auVar47._4_4_;
      fVar202 = auVar48._8_4_;
      auVar146._8_4_ = fVar202 * auVar47._8_4_;
      fVar204 = auVar48._12_4_;
      auVar146._12_4_ = fVar204 * auVar47._12_4_;
      auVar155._0_4_ = fVar93 * auVar52._0_4_;
      auVar155._4_4_ = fVar200 * auVar52._4_4_;
      auVar155._8_4_ = fVar202 * auVar52._8_4_;
      auVar155._12_4_ = fVar204 * auVar52._12_4_;
      auVar228._0_4_ = auVar49._0_4_ * fVar93;
      auVar228._4_4_ = auVar49._4_4_ * fVar200;
      auVar228._8_4_ = auVar49._8_4_ * fVar202;
      auVar228._12_4_ = auVar49._12_4_ * fVar204;
      auVar137._0_4_ = fVar93 * auVar46._0_4_;
      auVar137._4_4_ = fVar200 * auVar46._4_4_;
      auVar137._8_4_ = fVar202 * auVar46._8_4_;
      auVar137._12_4_ = fVar204 * auVar46._12_4_;
      auVar46 = vfmadd231ps_fma(auVar146,auVar43,auVar113);
      auVar42 = vfmadd231ps_fma(auVar155,auVar43,auVar192);
      auVar41 = vfmadd231ps_fma(auVar228,auVar43,auVar211);
      auVar43 = vfmadd231ps_fma(auVar137,auVar43,ZEXT816(0));
      auVar49 = vsubss_avx512f(auVar50,auVar44);
      auVar52 = vmovshdup_avx(auVar40);
      auVar100 = vfmadd231ss_fma(ZEXT416((uint)(auVar52._0_4_ * auVar44._0_4_)),auVar40,auVar49);
      auVar49 = vsubss_avx512f(auVar50,auVar45);
      auVar53 = vfmadd231ss_fma(ZEXT416((uint)(auVar52._0_4_ * auVar45._0_4_)),auVar40,auVar49);
      auVar40 = vdivss_avx512f(auVar50,ZEXT416((uint)fVar207));
      auVar52 = vsubps_avx(auVar42,auVar46);
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar48 = vmulps_avx512vl(auVar52,auVar44);
      auVar52 = vsubps_avx(auVar41,auVar42);
      auVar47 = vmulps_avx512vl(auVar52,auVar44);
      auVar52 = vsubps_avx(auVar43,auVar41);
      auVar52 = vmulps_avx512vl(auVar52,auVar44);
      auVar49 = vminps_avx(auVar47,auVar52);
      auVar52 = vmaxps_avx(auVar47,auVar52);
      auVar49 = vminps_avx(auVar48,auVar49);
      auVar52 = vmaxps_avx(auVar48,auVar52);
      auVar48 = vshufpd_avx(auVar49,auVar49,3);
      auVar47 = vshufpd_avx(auVar52,auVar52,3);
      auVar49 = vminps_avx(auVar49,auVar48);
      auVar52 = vmaxps_avx(auVar52,auVar47);
      fVar207 = auVar40._0_4_;
      auVar175._0_4_ = auVar49._0_4_ * fVar207;
      auVar175._4_4_ = auVar49._4_4_ * fVar207;
      auVar175._8_4_ = auVar49._8_4_ * fVar207;
      auVar175._12_4_ = auVar49._12_4_ * fVar207;
      auVar164._0_4_ = fVar207 * auVar52._0_4_;
      auVar164._4_4_ = fVar207 * auVar52._4_4_;
      auVar164._8_4_ = fVar207 * auVar52._8_4_;
      auVar164._12_4_ = fVar207 * auVar52._12_4_;
      auVar40 = vdivss_avx512f(auVar50,ZEXT416((uint)(auVar53._0_4_ - auVar100._0_4_)));
      auVar52 = vshufpd_avx(auVar46,auVar46,3);
      auVar49 = vshufpd_avx(auVar42,auVar42,3);
      auVar48 = vshufpd_avx(auVar41,auVar41,3);
      auVar47 = vshufpd_avx(auVar43,auVar43,3);
      auVar52 = vsubps_avx(auVar52,auVar46);
      auVar46 = vsubps_avx(auVar49,auVar42);
      auVar42 = vsubps_avx(auVar48,auVar41);
      auVar47 = vsubps_avx(auVar47,auVar43);
      auVar49 = vminps_avx(auVar52,auVar46);
      auVar52 = vmaxps_avx(auVar52,auVar46);
      auVar48 = vminps_avx(auVar42,auVar47);
      auVar48 = vminps_avx(auVar49,auVar48);
      auVar49 = vmaxps_avx(auVar42,auVar47);
      auVar52 = vmaxps_avx(auVar52,auVar49);
      fVar207 = auVar40._0_4_;
      auVar212._0_4_ = fVar207 * auVar48._0_4_;
      auVar212._4_4_ = fVar207 * auVar48._4_4_;
      auVar212._8_4_ = fVar207 * auVar48._8_4_;
      auVar212._12_4_ = fVar207 * auVar48._12_4_;
      auVar193._0_4_ = fVar207 * auVar52._0_4_;
      auVar193._4_4_ = fVar207 * auVar52._4_4_;
      auVar193._8_4_ = fVar207 * auVar52._8_4_;
      auVar193._12_4_ = fVar207 * auVar52._12_4_;
      auVar47 = vinsertps_avx(auVar39,auVar100,0x10);
      auVar54 = vpermt2ps_avx512vl(auVar39,_DAT_01feecd0,auVar53);
      auVar101._0_4_ = auVar47._0_4_ + auVar54._0_4_;
      auVar101._4_4_ = auVar47._4_4_ + auVar54._4_4_;
      auVar101._8_4_ = auVar47._8_4_ + auVar54._8_4_;
      auVar101._12_4_ = auVar47._12_4_ + auVar54._12_4_;
      auVar43 = vmulps_avx512vl(auVar101,auVar233._0_16_);
      auVar49 = vshufps_avx(auVar43,auVar43,0x54);
      uVar94 = auVar43._0_4_;
      auVar106._4_4_ = uVar94;
      auVar106._0_4_ = uVar94;
      auVar106._8_4_ = uVar94;
      auVar106._12_4_ = uVar94;
      auVar46 = vfmadd213ps_avx512vl(auVar240._0_16_,auVar106,local_2f8);
      auVar42 = vfmadd213ps_avx512vl(local_e8,auVar106,local_318);
      auVar48 = vfmadd213ps_fma(local_f8,auVar106,local_268);
      auVar52 = vsubps_avx(auVar42,auVar46);
      auVar46 = vfmadd213ps_fma(auVar52,auVar106,auVar46);
      auVar52 = vsubps_avx(auVar48,auVar42);
      auVar52 = vfmadd213ps_fma(auVar52,auVar106,auVar42);
      auVar52 = vsubps_avx(auVar52,auVar46);
      auVar48 = vfmadd231ps_fma(auVar46,auVar52,auVar106);
      auVar40 = vmulps_avx512vl(auVar52,auVar44);
      auVar219._8_8_ = auVar48._0_8_;
      auVar219._0_8_ = auVar48._0_8_;
      auVar52 = vshufpd_avx(auVar48,auVar48,3);
      auVar48 = vshufps_avx(auVar43,auVar43,0x55);
      auVar46 = vsubps_avx(auVar52,auVar219);
      auVar42 = vfmadd231ps_fma(auVar219,auVar48,auVar46);
      auVar229._8_8_ = auVar40._0_8_;
      auVar229._0_8_ = auVar40._0_8_;
      auVar52 = vshufpd_avx(auVar40,auVar40,3);
      auVar52 = vsubps_avx512vl(auVar52,auVar229);
      auVar52 = vfmadd213ps_avx512vl(auVar52,auVar48,auVar229);
      auVar48 = vxorps_avx512vl(auVar46,auVar243._0_16_);
      auVar40 = vmovshdup_avx512vl(auVar52);
      auVar41 = vxorps_avx512vl(auVar40,auVar243._0_16_);
      auVar44 = vmovshdup_avx512vl(auVar46);
      auVar239 = ZEXT464(5);
      auVar41 = vpermt2ps_avx512vl(auVar41,ZEXT416(5),auVar46);
      auVar46 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar40._0_4_ * auVar46._0_4_)),auVar52,auVar44);
      auVar48 = vpermt2ps_avx512vl(auVar52,SUB6416(ZEXT464(4),0),auVar48);
      auVar138._0_4_ = auVar46._0_4_;
      auVar138._4_4_ = auVar138._0_4_;
      auVar138._8_4_ = auVar138._0_4_;
      auVar138._12_4_ = auVar138._0_4_;
      auVar52 = vdivps_avx(auVar41,auVar138);
      auVar55 = vdivps_avx512vl(auVar48,auVar138);
      fVar207 = auVar42._0_4_;
      auVar48 = vshufps_avx(auVar42,auVar42,0x55);
      auVar220._0_4_ = fVar207 * auVar52._0_4_ + auVar48._0_4_ * auVar55._0_4_;
      auVar220._4_4_ = fVar207 * auVar52._4_4_ + auVar48._4_4_ * auVar55._4_4_;
      auVar220._8_4_ = fVar207 * auVar52._8_4_ + auVar48._8_4_ * auVar55._8_4_;
      auVar220._12_4_ = fVar207 * auVar52._12_4_ + auVar48._12_4_ * auVar55._12_4_;
      auVar44 = vsubps_avx(auVar49,auVar220);
      auVar48 = vmovshdup_avx(auVar52);
      auVar49 = vinsertps_avx(auVar175,auVar212,0x1c);
      auVar230._0_4_ = auVar48._0_4_ * auVar49._0_4_;
      auVar230._4_4_ = auVar48._4_4_ * auVar49._4_4_;
      auVar230._8_4_ = auVar48._8_4_ * auVar49._8_4_;
      auVar230._12_4_ = auVar48._12_4_ * auVar49._12_4_;
      auVar45 = vinsertps_avx512f(auVar164,auVar193,0x1c);
      auVar48 = vmulps_avx512vl(auVar48,auVar45);
      auVar41 = vminps_avx512vl(auVar230,auVar48);
      auVar42 = vmaxps_avx(auVar48,auVar230);
      auVar40 = vmovshdup_avx(auVar55);
      auVar48 = vinsertps_avx(auVar212,auVar175,0x4c);
      auVar213._0_4_ = auVar40._0_4_ * auVar48._0_4_;
      auVar213._4_4_ = auVar40._4_4_ * auVar48._4_4_;
      auVar213._8_4_ = auVar40._8_4_ * auVar48._8_4_;
      auVar213._12_4_ = auVar40._12_4_ * auVar48._12_4_;
      auVar46 = vinsertps_avx(auVar193,auVar164,0x4c);
      auVar194._0_4_ = auVar40._0_4_ * auVar46._0_4_;
      auVar194._4_4_ = auVar40._4_4_ * auVar46._4_4_;
      auVar194._8_4_ = auVar40._8_4_ * auVar46._8_4_;
      auVar194._12_4_ = auVar40._12_4_ * auVar46._12_4_;
      auVar40 = vminps_avx(auVar213,auVar194);
      auVar41 = vaddps_avx512vl(auVar41,auVar40);
      auVar40 = vmaxps_avx(auVar194,auVar213);
      auVar195._0_4_ = auVar42._0_4_ + auVar40._0_4_;
      auVar195._4_4_ = auVar42._4_4_ + auVar40._4_4_;
      auVar195._8_4_ = auVar42._8_4_ + auVar40._8_4_;
      auVar195._12_4_ = auVar42._12_4_ + auVar40._12_4_;
      auVar214._8_8_ = 0x3f80000000000000;
      auVar214._0_8_ = 0x3f80000000000000;
      auVar42 = vsubps_avx(auVar214,auVar195);
      auVar40 = vsubps_avx(auVar214,auVar41);
      auVar41 = vsubps_avx(auVar47,auVar43);
      auVar43 = vsubps_avx(auVar54,auVar43);
      fVar204 = auVar41._0_4_;
      auVar231._0_4_ = fVar204 * auVar42._0_4_;
      fVar205 = auVar41._4_4_;
      auVar231._4_4_ = fVar205 * auVar42._4_4_;
      fVar206 = auVar41._8_4_;
      auVar231._8_4_ = fVar206 * auVar42._8_4_;
      fVar99 = auVar41._12_4_;
      auVar231._12_4_ = fVar99 * auVar42._12_4_;
      auVar56 = vbroadcastss_avx512vl(auVar52);
      auVar49 = vmulps_avx512vl(auVar56,auVar49);
      auVar45 = vmulps_avx512vl(auVar56,auVar45);
      auVar56 = vminps_avx512vl(auVar49,auVar45);
      auVar45 = vmaxps_avx512vl(auVar45,auVar49);
      auVar49 = vbroadcastss_avx512vl(auVar55);
      auVar48 = vmulps_avx512vl(auVar49,auVar48);
      auVar49 = vmulps_avx512vl(auVar49,auVar46);
      auVar46 = vminps_avx512vl(auVar48,auVar49);
      auVar46 = vaddps_avx512vl(auVar56,auVar46);
      auVar41 = vmulps_avx512vl(auVar41,auVar40);
      in_ZMM17 = ZEXT1664(auVar41);
      fVar207 = auVar43._0_4_;
      auVar196._0_4_ = fVar207 * auVar42._0_4_;
      fVar93 = auVar43._4_4_;
      auVar196._4_4_ = fVar93 * auVar42._4_4_;
      fVar200 = auVar43._8_4_;
      auVar196._8_4_ = fVar200 * auVar42._8_4_;
      fVar202 = auVar43._12_4_;
      auVar196._12_4_ = fVar202 * auVar42._12_4_;
      auVar215._0_4_ = fVar207 * auVar40._0_4_;
      auVar215._4_4_ = fVar93 * auVar40._4_4_;
      auVar215._8_4_ = fVar200 * auVar40._8_4_;
      auVar215._12_4_ = fVar202 * auVar40._12_4_;
      auVar49 = vmaxps_avx(auVar49,auVar48);
      auVar165._0_4_ = auVar45._0_4_ + auVar49._0_4_;
      auVar165._4_4_ = auVar45._4_4_ + auVar49._4_4_;
      auVar165._8_4_ = auVar45._8_4_ + auVar49._8_4_;
      auVar165._12_4_ = auVar45._12_4_ + auVar49._12_4_;
      auVar176._8_8_ = 0x3f800000;
      auVar176._0_8_ = 0x3f800000;
      auVar49 = vsubps_avx(auVar176,auVar165);
      auVar48 = vsubps_avx512vl(auVar176,auVar46);
      auVar226._0_4_ = fVar204 * auVar49._0_4_;
      auVar226._4_4_ = fVar205 * auVar49._4_4_;
      auVar226._8_4_ = fVar206 * auVar49._8_4_;
      auVar226._12_4_ = fVar99 * auVar49._12_4_;
      auVar221._0_4_ = fVar204 * auVar48._0_4_;
      auVar221._4_4_ = fVar205 * auVar48._4_4_;
      auVar221._8_4_ = fVar206 * auVar48._8_4_;
      auVar221._12_4_ = fVar99 * auVar48._12_4_;
      auVar166._0_4_ = fVar207 * auVar49._0_4_;
      auVar166._4_4_ = fVar93 * auVar49._4_4_;
      auVar166._8_4_ = fVar200 * auVar49._8_4_;
      auVar166._12_4_ = fVar202 * auVar49._12_4_;
      auVar177._0_4_ = fVar207 * auVar48._0_4_;
      auVar177._4_4_ = fVar93 * auVar48._4_4_;
      auVar177._8_4_ = fVar200 * auVar48._8_4_;
      auVar177._12_4_ = fVar202 * auVar48._12_4_;
      auVar49 = vminps_avx(auVar226,auVar221);
      auVar48 = vminps_avx512vl(auVar166,auVar177);
      auVar46 = vminps_avx512vl(auVar49,auVar48);
      auVar49 = vmaxps_avx(auVar221,auVar226);
      auVar48 = vmaxps_avx(auVar177,auVar166);
      auVar48 = vmaxps_avx(auVar48,auVar49);
      auVar42 = vminps_avx512vl(auVar231,auVar41);
      auVar49 = vminps_avx(auVar196,auVar215);
      auVar49 = vminps_avx(auVar42,auVar49);
      auVar49 = vhaddps_avx(auVar46,auVar49);
      auVar42 = vmaxps_avx512vl(auVar41,auVar231);
      auVar46 = vmaxps_avx(auVar215,auVar196);
      auVar46 = vmaxps_avx(auVar46,auVar42);
      auVar48 = vhaddps_avx(auVar48,auVar46);
      auVar49 = vshufps_avx(auVar49,auVar49,0xe8);
      auVar48 = vshufps_avx(auVar48,auVar48,0xe8);
      auVar167._0_4_ = auVar49._0_4_ + auVar44._0_4_;
      auVar167._4_4_ = auVar49._4_4_ + auVar44._4_4_;
      auVar167._8_4_ = auVar49._8_4_ + auVar44._8_4_;
      auVar167._12_4_ = auVar49._12_4_ + auVar44._12_4_;
      auVar178._0_4_ = auVar48._0_4_ + auVar44._0_4_;
      auVar178._4_4_ = auVar48._4_4_ + auVar44._4_4_;
      auVar178._8_4_ = auVar48._8_4_ + auVar44._8_4_;
      auVar178._12_4_ = auVar48._12_4_ + auVar44._12_4_;
      auVar49 = vmaxps_avx(auVar47,auVar167);
      auVar48 = vminps_avx(auVar178,auVar54);
      uVar32 = vcmpps_avx512vl(auVar48,auVar49,1);
    } while ((uVar32 & 3) != 0);
    uVar32 = vcmpps_avx512vl(auVar178,auVar54,1);
    uVar9 = vcmpps_avx512vl(auVar39,auVar167,1);
    if (((ushort)uVar9 & (ushort)uVar32 & 1) == 0) {
      bVar24 = 0;
    }
    else {
      auVar49 = vmovshdup_avx(auVar167);
      bVar24 = auVar100._0_4_ < auVar49._0_4_ & (byte)(uVar32 >> 1) & 0x7f;
    }
    auVar239 = ZEXT1664(local_318);
    if (((3 < (uint)uVar26 || uVar33 != 0 && !bVar37) | bVar24) == 1) {
      lVar28 = 200;
      do {
        auVar39 = vsubss_avx512f(auVar50,auVar44);
        fVar200 = auVar39._0_4_;
        fVar207 = fVar200 * fVar200 * fVar200;
        fVar202 = auVar44._0_4_;
        fVar93 = fVar202 * 3.0 * fVar200 * fVar200;
        fVar200 = fVar200 * fVar202 * fVar202 * 3.0;
        auVar125._4_4_ = fVar207;
        auVar125._0_4_ = fVar207;
        auVar125._8_4_ = fVar207;
        auVar125._12_4_ = fVar207;
        auVar114._4_4_ = fVar93;
        auVar114._0_4_ = fVar93;
        auVar114._8_4_ = fVar93;
        auVar114._12_4_ = fVar93;
        auVar96._4_4_ = fVar200;
        auVar96._0_4_ = fVar200;
        auVar96._8_4_ = fVar200;
        auVar96._12_4_ = fVar200;
        fVar202 = fVar202 * fVar202 * fVar202;
        auVar147._0_4_ = (float)local_188._0_4_ * fVar202;
        auVar147._4_4_ = (float)local_188._4_4_ * fVar202;
        auVar147._8_4_ = fStack_180 * fVar202;
        auVar147._12_4_ = fStack_17c * fVar202;
        auVar39 = vfmadd231ps_fma(auVar147,local_268,auVar96);
        auVar39 = vfmadd231ps_avx512vl(auVar39,local_318,auVar114);
        auVar39 = vfmadd231ps_avx512vl(auVar39,local_2f8,auVar125);
        auVar97._8_8_ = auVar39._0_8_;
        auVar97._0_8_ = auVar39._0_8_;
        auVar39 = vshufpd_avx(auVar39,auVar39,3);
        auVar49 = vshufps_avx(auVar44,auVar44,0x55);
        auVar39 = vsubps_avx(auVar39,auVar97);
        auVar49 = vfmadd213ps_fma(auVar39,auVar49,auVar97);
        fVar207 = auVar49._0_4_;
        auVar39 = vshufps_avx(auVar49,auVar49,0x55);
        auVar98._0_4_ = auVar52._0_4_ * fVar207 + auVar55._0_4_ * auVar39._0_4_;
        auVar98._4_4_ = auVar52._4_4_ * fVar207 + auVar55._4_4_ * auVar39._4_4_;
        auVar98._8_4_ = auVar52._8_4_ * fVar207 + auVar55._8_4_ * auVar39._8_4_;
        auVar98._12_4_ = auVar52._12_4_ * fVar207 + auVar55._12_4_ * auVar39._12_4_;
        auVar44 = vsubps_avx(auVar44,auVar98);
        auVar39 = vandps_avx512vl(auVar49,auVar234._0_16_);
        auVar49 = vprolq_avx512vl(auVar39,0x20);
        auVar39 = vmaxss_avx(auVar49,auVar39);
        if (auVar39._0_4_ < (float)local_198._0_4_) {
          fVar207 = auVar44._0_4_;
          if (0.0 <= fVar207) {
            auVar39 = vucomiss_avx512f(auVar44);
            auVar242 = ZEXT1664(auVar39);
            if (0.0 <= fVar207) {
              auVar39 = vmovshdup_avx(auVar44);
              fVar93 = auVar39._0_4_;
              if (0.0 <= fVar93) {
                auVar52 = vucomiss_avx512f(auVar39);
                auVar242 = ZEXT1664(auVar52);
                if (0.0 <= fVar93) {
                  auVar50 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                          ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
                  auVar41 = vinsertps_avx(auVar50,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2])
                                          ,0x28);
                  aVar1 = (ray->org).field_0;
                  auVar50 = vsubps_avx(local_1a8,(undefined1  [16])aVar1);
                  auVar50 = vdpps_avx(auVar50,auVar41,0x7f);
                  auVar49 = vsubps_avx(local_1e8,(undefined1  [16])aVar1);
                  auVar49 = vdpps_avx(auVar49,auVar41,0x7f);
                  auVar48 = vsubps_avx(local_1f8,(undefined1  [16])aVar1);
                  auVar48 = vdpps_avx(auVar48,auVar41,0x7f);
                  auVar47 = vsubps_avx(local_1c8,(undefined1  [16])aVar1);
                  auVar47 = vdpps_avx(auVar47,auVar41,0x7f);
                  auVar46 = vsubps_avx(_local_1b8,(undefined1  [16])aVar1);
                  auVar46 = vdpps_avx(auVar46,auVar41,0x7f);
                  auVar42 = vsubps_avx(_local_208,(undefined1  [16])aVar1);
                  auVar42 = vdpps_avx(auVar42,auVar41,0x7f);
                  auVar40 = vsubps_avx(_local_218,(undefined1  [16])aVar1);
                  auVar40 = vdpps_avx(auVar40,auVar41,0x7f);
                  auVar43 = vsubps_avx(_local_1d8,(undefined1  [16])aVar1);
                  auVar41 = vdpps_avx(auVar43,auVar41,0x7f);
                  auVar43 = vsubss_avx512f(auVar52,auVar39);
                  auVar39 = vfmadd231ss_fma(ZEXT416((uint)(auVar46._0_4_ * fVar93)),auVar43,auVar50)
                  ;
                  auVar50 = vfmadd231ss_fma(ZEXT416((uint)(auVar42._0_4_ * fVar93)),auVar43,auVar49)
                  ;
                  auVar49 = vfmadd231ss_fma(ZEXT416((uint)(auVar40._0_4_ * fVar93)),auVar43,auVar48)
                  ;
                  auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar93 * auVar41._0_4_)),auVar43,auVar47)
                  ;
                  auVar52 = vsubss_avx512f(auVar52,auVar44);
                  auVar148._0_4_ = auVar52._0_4_;
                  fVar93 = auVar148._0_4_ * auVar148._0_4_ * auVar148._0_4_;
                  fVar200 = fVar207 * 3.0 * auVar148._0_4_ * auVar148._0_4_;
                  fVar202 = auVar148._0_4_ * fVar207 * fVar207 * 3.0;
                  fVar205 = fVar207 * fVar207 * fVar207;
                  auVar52 = vfmadd231ss_fma(ZEXT416((uint)(fVar205 * auVar48._0_4_)),
                                            ZEXT416((uint)fVar202),auVar49);
                  auVar52 = vfmadd231ss_fma(auVar52,ZEXT416((uint)fVar200),auVar50);
                  auVar39 = vfmadd231ss_fma(auVar52,ZEXT416((uint)fVar93),auVar39);
                  fVar204 = auVar39._0_4_;
                  if (((ray->org).field_0.m128[3] <= fVar204) &&
                     (fVar206 = ray->tfar, fVar204 <= fVar206)) {
                    auVar39 = vshufps_avx(auVar44,auVar44,0x55);
                    auVar50 = vsubps_avx512vl(auVar51,auVar39);
                    fVar99 = auVar39._0_4_;
                    auVar179._0_4_ = fVar99 * (float)local_1b8._0_4_;
                    fVar111 = auVar39._4_4_;
                    auVar179._4_4_ = fVar111 * (float)local_1b8._4_4_;
                    fVar118 = auVar39._8_4_;
                    auVar179._8_4_ = fVar118 * fStack_1b0;
                    fVar119 = auVar39._12_4_;
                    auVar179._12_4_ = fVar119 * fStack_1ac;
                    auVar184._0_4_ = fVar99 * (float)local_208._0_4_;
                    auVar184._4_4_ = fVar111 * (float)local_208._4_4_;
                    auVar184._8_4_ = fVar118 * fStack_200;
                    auVar184._12_4_ = fVar119 * fStack_1fc;
                    auVar197._0_4_ = fVar99 * (float)local_218._0_4_;
                    auVar197._4_4_ = fVar111 * (float)local_218._4_4_;
                    auVar197._8_4_ = fVar118 * fStack_210;
                    auVar197._12_4_ = fVar119 * fStack_20c;
                    auVar156._0_4_ = fVar99 * (float)local_1d8._0_4_;
                    auVar156._4_4_ = fVar111 * (float)local_1d8._4_4_;
                    auVar156._8_4_ = fVar118 * fStack_1d0;
                    auVar156._12_4_ = fVar119 * fStack_1cc;
                    auVar39 = vfmadd231ps_fma(auVar179,auVar50,local_1a8);
                    auVar52 = vfmadd231ps_fma(auVar184,auVar50,local_1e8);
                    auVar51 = vfmadd231ps_fma(auVar197,auVar50,local_1f8);
                    auVar50 = vfmadd231ps_fma(auVar156,auVar50,local_1c8);
                    auVar39 = vsubps_avx(auVar52,auVar39);
                    auVar52 = vsubps_avx(auVar51,auVar52);
                    auVar51 = vsubps_avx(auVar50,auVar51);
                    auVar198._0_4_ = fVar207 * auVar52._0_4_;
                    auVar198._4_4_ = fVar207 * auVar52._4_4_;
                    auVar198._8_4_ = fVar207 * auVar52._8_4_;
                    auVar198._12_4_ = fVar207 * auVar52._12_4_;
                    auVar148._4_4_ = auVar148._0_4_;
                    auVar148._8_4_ = auVar148._0_4_;
                    auVar148._12_4_ = auVar148._0_4_;
                    auVar39 = vfmadd231ps_fma(auVar198,auVar148,auVar39);
                    auVar157._0_4_ = fVar207 * auVar51._0_4_;
                    auVar157._4_4_ = fVar207 * auVar51._4_4_;
                    auVar157._8_4_ = fVar207 * auVar51._8_4_;
                    auVar157._12_4_ = fVar207 * auVar51._12_4_;
                    auVar52 = vfmadd231ps_fma(auVar157,auVar148,auVar52);
                    auVar158._0_4_ = fVar207 * auVar52._0_4_;
                    auVar158._4_4_ = fVar207 * auVar52._4_4_;
                    auVar158._8_4_ = fVar207 * auVar52._8_4_;
                    auVar158._12_4_ = fVar207 * auVar52._12_4_;
                    auVar39 = vfmadd231ps_fma(auVar158,auVar148,auVar39);
                    auVar13._8_4_ = 0x40400000;
                    auVar13._0_8_ = 0x4040000040400000;
                    auVar13._12_4_ = 0x40400000;
                    auVar39 = vmulps_avx512vl(auVar39,auVar13);
                    pGVar5 = (context->scene->geometries).items[local_300].ptr;
                    if ((pGVar5->mask & ray->mask) == 0) {
LAB_01d33030:
                      bVar24 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar24 = 1, pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar139._0_4_ = fVar205 * (float)local_138._0_4_;
                      auVar139._4_4_ = fVar205 * (float)local_138._4_4_;
                      auVar139._8_4_ = fVar205 * fStack_130;
                      auVar139._12_4_ = fVar205 * fStack_12c;
                      auVar126._4_4_ = fVar202;
                      auVar126._0_4_ = fVar202;
                      auVar126._8_4_ = fVar202;
                      auVar126._12_4_ = fVar202;
                      auVar52 = vfmadd132ps_fma(auVar126,auVar139,local_128);
                      auVar115._4_4_ = fVar200;
                      auVar115._0_4_ = fVar200;
                      auVar115._8_4_ = fVar200;
                      auVar115._12_4_ = fVar200;
                      auVar52 = vfmadd132ps_fma(auVar115,auVar52,local_118);
                      auVar107._4_4_ = fVar93;
                      auVar107._0_4_ = fVar93;
                      auVar107._8_4_ = fVar93;
                      auVar107._12_4_ = fVar93;
                      auVar50 = vfmadd132ps_fma(auVar107,auVar52,local_108);
                      auVar52 = vshufps_avx(auVar50,auVar50,0xc9);
                      auVar51 = vshufps_avx(auVar39,auVar39,0xc9);
                      auVar108._0_4_ = auVar50._0_4_ * auVar51._0_4_;
                      auVar108._4_4_ = auVar50._4_4_ * auVar51._4_4_;
                      auVar108._8_4_ = auVar50._8_4_ * auVar51._8_4_;
                      auVar108._12_4_ = auVar50._12_4_ * auVar51._12_4_;
                      auVar52 = vfmsub231ps_fma(auVar108,auVar39,auVar52);
                      auVar39 = vshufps_avx(auVar52,auVar52,0xe9);
                      local_168 = vmovlps_avx(auVar39);
                      local_160 = auVar52._0_4_;
                      local_15c = vmovlps_avx(auVar44);
                      local_154 = (int)local_250;
                      local_150 = (int)local_300;
                      local_14c = context->user->instID[0];
                      local_148 = context->user->instPrimID[0];
                      ray->tfar = fVar204;
                      local_32c = -1;
                      local_248.valid = &local_32c;
                      local_248.geometryUserPtr = pGVar5->userPtr;
                      local_248.context = context->user;
                      local_248.hit = (RTCHitN *)&local_168;
                      local_248.N = 1;
                      local_248.ray = (RTCRayN *)ray;
                      if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar5->occlusionFilterN)(&local_248);
                        auVar240 = ZEXT1664(local_328);
                        auVar242 = ZEXT464(0x3f800000);
                        auVar238 = ZEXT3264(_DAT_01feed20);
                        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar237 = ZEXT1664(auVar39);
                        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                        auVar236 = ZEXT1664(auVar39);
                        auVar62 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar235 = ZEXT3264(auVar62);
                        auVar75._16_16_ = auVar62._16_16_;
                        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar234 = ZEXT1664(auVar39);
                        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                        auVar233 = ZEXT1664(auVar39);
                        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar243 = ZEXT1664(auVar39);
                        if (*local_248.valid != 0) goto LAB_01d32f66;
LAB_01d33024:
                        auVar242 = ZEXT464(0x3f800000);
                        ray->tfar = fVar206;
                        goto LAB_01d33030;
                      }
LAB_01d32f66:
                      p_Var6 = context->args->filter;
                      if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var6)(&local_248);
                        auVar240 = ZEXT1664(local_328);
                        auVar242 = ZEXT464(0x3f800000);
                        auVar238 = ZEXT3264(_DAT_01feed20);
                        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar237 = ZEXT1664(auVar39);
                        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                        auVar236 = ZEXT1664(auVar39);
                        auVar62 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar235 = ZEXT3264(auVar62);
                        auVar75._16_16_ = auVar62._16_16_;
                        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar234 = ZEXT1664(auVar39);
                        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                        auVar233 = ZEXT1664(auVar39);
                        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar243 = ZEXT1664(auVar39);
                        if (*local_248.valid == 0) goto LAB_01d33024;
                      }
                      bVar24 = 1;
                    }
                    bVar31 = (bool)(bVar31 | bVar24);
                  }
                }
              }
            }
          }
          break;
        }
        lVar28 = lVar28 + -1;
      } while (lVar28 != 0);
      goto LAB_01d32205;
    }
    auVar40 = vinsertps_avx(auVar100,auVar53,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }